

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::sse2::CurveNiIntersector1<4>::
     intersect_t<embree::sse2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,4>,embree::sse2::Intersect1EpilogMU<4,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  Primitive *pPVar6;
  Primitive PVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  undefined8 uVar11;
  undefined6 uVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  int iVar32;
  long lVar33;
  undefined1 *puVar34;
  RayHit *pRVar35;
  undefined4 uVar36;
  ulong uVar37;
  RTCIntersectArguments *pRVar38;
  RTCFilterFunctionN p_Var39;
  RTCFilterFunctionN extraout_RDX;
  RTCFilterFunctionN extraout_RDX_00;
  RTCFilterFunctionN extraout_RDX_01;
  RTCFilterFunctionN extraout_RDX_02;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  short sVar49;
  float fVar50;
  uint uVar51;
  float fVar83;
  float fVar85;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint uVar84;
  uint uVar86;
  uint uVar87;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar88;
  float fVar89;
  float fVar110;
  float fVar112;
  vfloat4 v;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar111;
  float fVar113;
  float fVar114;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar115;
  float fVar116;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar127;
  float fVar140;
  float fVar141;
  vfloat4 v_1;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar152;
  float fVar153;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar155;
  float fVar165;
  float fVar167;
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar170;
  float fVar178;
  float fVar179;
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar180;
  float fVar198;
  float fVar199;
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar208;
  float fVar209;
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar210;
  float fVar214;
  float fVar215;
  uint auVar216 [1];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  uint auVar217 [1];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar236;
  float fVar237;
  float fVar245;
  float fVar247;
  float fVar249;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar246;
  float fVar248;
  float fVar250;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar251;
  float fVar252;
  float fVar256;
  float fVar258;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar257;
  float fVar259;
  float fVar260;
  undefined1 auVar255 [16];
  float fVar261;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 local_43c [32];
  float fStack_41c;
  undefined1 local_418 [16];
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  uint auStack_3f0 [1];
  uint auStack_3ec [1];
  undefined1 local_3e8 [8];
  undefined8 uStack_3e0;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  Precalculations *local_3b8;
  RayQueryContext *local_3b0;
  Primitive *local_3a8;
  ulong local_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  undefined8 uStack_360;
  ulong local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  RTCFilterFunctionNArguments local_318;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8 [8];
  undefined8 uStack_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  float local_230;
  float local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  uint local_21c;
  uint local_218;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  uint local_128;
  int local_124;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  float local_c8 [4];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 uVar81;
  undefined2 uVar82;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  
  PVar7 = prim[1];
  uVar37 = (ulong)(byte)PVar7;
  pPVar6 = prim + uVar37 * 0x19 + 6;
  fVar112 = *(float *)(pPVar6 + 0xc);
  fVar127 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar6) * fVar112;
  fVar140 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar6 + 4)) * fVar112;
  fVar141 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar6 + 8)) * fVar112;
  fVar88 = fVar112 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar110 = fVar112 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar112 = fVar112 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar36 = *(undefined4 *)(prim + uVar37 * 4 + 6);
  uVar81 = (undefined1)((uint)uVar36 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar36 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar36));
  uVar81 = (undefined1)((uint)uVar36 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar81),uVar81);
  sVar49 = CONCAT11((char)uVar36,(char)uVar36);
  uVar42 = CONCAT62(uVar12,sVar49);
  auVar52._8_4_ = 0;
  auVar52._0_8_ = uVar42;
  auVar52._12_2_ = uVar82;
  auVar52._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar212._12_4_ = auVar52._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar42;
  auVar212._10_2_ = uVar82;
  auVar62._10_6_ = auVar212._10_6_;
  auVar62._8_2_ = uVar82;
  auVar62._0_8_ = uVar42;
  uVar82 = (undefined2)uVar12;
  auVar13._4_8_ = auVar62._8_8_;
  auVar13._2_2_ = uVar82;
  auVar13._0_2_ = uVar82;
  fVar115 = (float)((int)sVar49 >> 8);
  fVar124 = (float)(auVar13._0_4_ >> 0x18);
  fVar125 = (float)(auVar62._8_4_ >> 0x18);
  uVar36 = *(undefined4 *)(prim + uVar37 * 5 + 6);
  uVar81 = (undefined1)((uint)uVar36 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar36 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar36));
  uVar81 = (undefined1)((uint)uVar36 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar81),uVar81);
  sVar49 = CONCAT11((char)uVar36,(char)uVar36);
  uVar42 = CONCAT62(uVar12,sVar49);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar42;
  auVar55._12_2_ = uVar82;
  auVar55._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar42;
  auVar54._10_2_ = uVar82;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._8_2_ = uVar82;
  auVar53._0_8_ = uVar42;
  uVar82 = (undefined2)uVar12;
  auVar14._4_8_ = auVar53._8_8_;
  auVar14._2_2_ = uVar82;
  auVar14._0_2_ = uVar82;
  fVar142 = (float)((int)sVar49 >> 8);
  fVar152 = (float)(auVar14._0_4_ >> 0x18);
  fVar153 = (float)(auVar53._8_4_ >> 0x18);
  uVar36 = *(undefined4 *)(prim + uVar37 * 6 + 6);
  uVar81 = (undefined1)((uint)uVar36 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar36 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar36));
  uVar81 = (undefined1)((uint)uVar36 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar81),uVar81);
  sVar49 = CONCAT11((char)uVar36,(char)uVar36);
  uVar42 = CONCAT62(uVar12,sVar49);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar42;
  auVar58._12_2_ = uVar82;
  auVar58._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar42;
  auVar57._10_2_ = uVar82;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar82;
  auVar56._0_8_ = uVar42;
  uVar82 = (undefined2)uVar12;
  auVar15._4_8_ = auVar56._8_8_;
  auVar15._2_2_ = uVar82;
  auVar15._0_2_ = uVar82;
  fVar154 = (float)((int)sVar49 >> 8);
  fVar165 = (float)(auVar15._0_4_ >> 0x18);
  fVar167 = (float)(auVar56._8_4_ >> 0x18);
  uVar36 = *(undefined4 *)(prim + uVar37 * 0xb + 6);
  uVar81 = (undefined1)((uint)uVar36 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar36 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar36));
  uVar81 = (undefined1)((uint)uVar36 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar81),uVar81);
  sVar49 = CONCAT11((char)uVar36,(char)uVar36);
  uVar42 = CONCAT62(uVar12,sVar49);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar42;
  auVar61._12_2_ = uVar82;
  auVar61._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar42;
  auVar60._10_2_ = uVar82;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = uVar82;
  auVar59._0_8_ = uVar42;
  uVar82 = (undefined2)uVar12;
  auVar16._4_8_ = auVar59._8_8_;
  auVar16._2_2_ = uVar82;
  auVar16._0_2_ = uVar82;
  fVar50 = (float)((int)sVar49 >> 8);
  fVar83 = (float)(auVar16._0_4_ >> 0x18);
  fVar85 = (float)(auVar59._8_4_ >> 0x18);
  uVar36 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  uVar81 = (undefined1)((uint)uVar36 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar36 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar36));
  uVar81 = (undefined1)((uint)uVar36 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar81),uVar81);
  sVar49 = CONCAT11((char)uVar36,(char)uVar36);
  uVar42 = CONCAT62(uVar12,sVar49);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar42;
  auVar173._12_2_ = uVar82;
  auVar173._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar42;
  auVar172._10_2_ = uVar82;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar82;
  auVar171._0_8_ = uVar42;
  uVar82 = (undefined2)uVar12;
  auVar17._4_8_ = auVar171._8_8_;
  auVar17._2_2_ = uVar82;
  auVar17._0_2_ = uVar82;
  fVar170 = (float)((int)sVar49 >> 8);
  fVar178 = (float)(auVar17._0_4_ >> 0x18);
  fVar179 = (float)(auVar171._8_4_ >> 0x18);
  uVar36 = *(undefined4 *)(prim + (uint)(byte)PVar7 * 0xc + uVar37 + 6);
  uVar81 = (undefined1)((uint)uVar36 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar36 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar36));
  uVar81 = (undefined1)((uint)uVar36 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar81),uVar81);
  sVar49 = CONCAT11((char)uVar36,(char)uVar36);
  uVar42 = CONCAT62(uVar12,sVar49);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar42;
  auVar183._12_2_ = uVar82;
  auVar183._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar42;
  auVar182._10_2_ = uVar82;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar82;
  auVar181._0_8_ = uVar42;
  uVar82 = (undefined2)uVar12;
  auVar18._4_8_ = auVar181._8_8_;
  auVar18._2_2_ = uVar82;
  auVar18._0_2_ = uVar82;
  fVar210 = (float)((int)sVar49 >> 8);
  fVar214 = (float)(auVar18._0_4_ >> 0x18);
  fVar215 = (float)(auVar181._8_4_ >> 0x18);
  uVar41 = (ulong)(uint)((int)(uVar37 * 9) * 2);
  uVar36 = *(undefined4 *)(prim + uVar41 + 6);
  uVar81 = (undefined1)((uint)uVar36 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar36 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar36));
  uVar81 = (undefined1)((uint)uVar36 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar81),uVar81);
  sVar49 = CONCAT11((char)uVar36,(char)uVar36);
  uVar42 = CONCAT62(uVar12,sVar49);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar42;
  auVar186._12_2_ = uVar82;
  auVar186._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar42;
  auVar185._10_2_ = uVar82;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar82;
  auVar184._0_8_ = uVar42;
  uVar82 = (undefined2)uVar12;
  auVar19._4_8_ = auVar184._8_8_;
  auVar19._2_2_ = uVar82;
  auVar19._0_2_ = uVar82;
  fVar200 = (float)((int)sVar49 >> 8);
  fVar208 = (float)(auVar19._0_4_ >> 0x18);
  fVar209 = (float)(auVar184._8_4_ >> 0x18);
  uVar36 = *(undefined4 *)(prim + uVar41 + uVar37 + 6);
  uVar81 = (undefined1)((uint)uVar36 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar36 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar36));
  uVar81 = (undefined1)((uint)uVar36 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar81),uVar81);
  sVar49 = CONCAT11((char)uVar36,(char)uVar36);
  uVar42 = CONCAT62(uVar12,sVar49);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar42;
  auVar189._12_2_ = uVar82;
  auVar189._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar42;
  auVar188._10_2_ = uVar82;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar82;
  auVar187._0_8_ = uVar42;
  uVar82 = (undefined2)uVar12;
  auVar20._4_8_ = auVar187._8_8_;
  auVar20._2_2_ = uVar82;
  auVar20._0_2_ = uVar82;
  fVar218 = (float)((int)sVar49 >> 8);
  fVar219 = (float)(auVar20._0_4_ >> 0x18);
  fVar220 = (float)(auVar187._8_4_ >> 0x18);
  fVar221 = (float)(auVar188._12_4_ >> 0x18);
  uVar41 = (ulong)(uint)((int)(uVar37 * 5) << 2);
  uVar36 = *(undefined4 *)(prim + uVar41 + 6);
  uVar81 = (undefined1)((uint)uVar36 >> 0x18);
  uVar82 = CONCAT11(uVar81,uVar81);
  uVar81 = (undefined1)((uint)uVar36 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar36));
  uVar81 = (undefined1)((uint)uVar36 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar81),uVar81);
  sVar49 = CONCAT11((char)uVar36,(char)uVar36);
  uVar42 = CONCAT62(uVar12,sVar49);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar42;
  auVar192._12_2_ = uVar82;
  auVar192._14_2_ = uVar82;
  uVar82 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar42;
  auVar191._10_2_ = uVar82;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar82;
  auVar190._0_8_ = uVar42;
  uVar82 = (undefined2)uVar12;
  auVar21._4_8_ = auVar190._8_8_;
  auVar21._2_2_ = uVar82;
  auVar21._0_2_ = uVar82;
  fVar251 = (float)((int)sVar49 >> 8);
  fVar256 = (float)(auVar21._0_4_ >> 0x18);
  fVar258 = (float)(auVar190._8_4_ >> 0x18);
  fVar236 = fVar88 * fVar115 + fVar110 * fVar142 + fVar112 * fVar154;
  fVar245 = fVar88 * fVar124 + fVar110 * fVar152 + fVar112 * fVar165;
  fVar247 = fVar88 * fVar125 + fVar110 * fVar153 + fVar112 * fVar167;
  fVar249 = fVar88 * (float)(auVar212._12_4_ >> 0x18) +
            fVar110 * (float)(auVar54._12_4_ >> 0x18) + fVar112 * (float)(auVar57._12_4_ >> 0x18);
  fVar222 = fVar88 * fVar50 + fVar110 * fVar170 + fVar112 * fVar210;
  fVar227 = fVar88 * fVar83 + fVar110 * fVar178 + fVar112 * fVar214;
  fVar230 = fVar88 * fVar85 + fVar110 * fVar179 + fVar112 * fVar215;
  fVar233 = fVar88 * (float)(auVar60._12_4_ >> 0x18) +
            fVar110 * (float)(auVar172._12_4_ >> 0x18) + fVar112 * (float)(auVar182._12_4_ >> 0x18);
  fVar180 = fVar88 * fVar200 + fVar110 * fVar218 + fVar112 * fVar251;
  fVar198 = fVar88 * fVar208 + fVar110 * fVar219 + fVar112 * fVar256;
  fVar199 = fVar88 * fVar209 + fVar110 * fVar220 + fVar112 * fVar258;
  fVar88 = fVar88 * (float)(auVar185._12_4_ >> 0x18) +
           fVar110 * fVar221 + fVar112 * (float)(auVar191._12_4_ >> 0x18);
  fVar116 = fVar115 * fVar127 + fVar142 * fVar140 + fVar154 * fVar141;
  fVar165 = fVar124 * fVar127 + fVar152 * fVar140 + fVar165 * fVar141;
  fVar167 = fVar125 * fVar127 + fVar153 * fVar140 + fVar167 * fVar141;
  fVar126 = (float)(auVar212._12_4_ >> 0x18) * fVar127 +
            (float)(auVar54._12_4_ >> 0x18) * fVar140 + (float)(auVar57._12_4_ >> 0x18) * fVar141;
  fVar170 = fVar50 * fVar127 + fVar170 * fVar140 + fVar210 * fVar141;
  fVar178 = fVar83 * fVar127 + fVar178 * fVar140 + fVar214 * fVar141;
  fVar179 = fVar85 * fVar127 + fVar179 * fVar140 + fVar215 * fVar141;
  fVar210 = (float)(auVar60._12_4_ >> 0x18) * fVar127 +
            (float)(auVar172._12_4_ >> 0x18) * fVar140 + (float)(auVar182._12_4_ >> 0x18) * fVar141;
  fVar142 = fVar127 * fVar200 + fVar140 * fVar218 + fVar141 * fVar251;
  fVar152 = fVar127 * fVar208 + fVar140 * fVar219 + fVar141 * fVar256;
  fVar153 = fVar127 * fVar209 + fVar140 * fVar220 + fVar141 * fVar258;
  fVar154 = fVar127 * (float)(auVar185._12_4_ >> 0x18) +
            fVar140 * fVar221 + fVar141 * (float)(auVar191._12_4_ >> 0x18);
  fVar112 = (float)DAT_01ff1d40;
  fVar50 = DAT_01ff1d40._4_4_;
  fVar83 = DAT_01ff1d40._8_4_;
  fVar85 = DAT_01ff1d40._12_4_;
  uVar43 = -(uint)(fVar112 <= ABS(fVar236));
  uVar44 = -(uint)(fVar50 <= ABS(fVar245));
  uVar45 = -(uint)(fVar83 <= ABS(fVar247));
  uVar47 = -(uint)(fVar85 <= ABS(fVar249));
  auVar238._0_4_ = (uint)fVar236 & uVar43;
  auVar238._4_4_ = (uint)fVar245 & uVar44;
  auVar238._8_4_ = (uint)fVar247 & uVar45;
  auVar238._12_4_ = (uint)fVar249 & uVar47;
  auVar128._0_4_ = ~uVar43 & (uint)fVar112;
  auVar128._4_4_ = ~uVar44 & (uint)fVar50;
  auVar128._8_4_ = ~uVar45 & (uint)fVar83;
  auVar128._12_4_ = ~uVar47 & (uint)fVar85;
  auVar128 = auVar128 | auVar238;
  uVar43 = -(uint)(fVar112 <= ABS(fVar222));
  uVar44 = -(uint)(fVar50 <= ABS(fVar227));
  uVar45 = -(uint)(fVar83 <= ABS(fVar230));
  uVar47 = -(uint)(fVar85 <= ABS(fVar233));
  auVar207._0_4_ = (uint)fVar222 & uVar43;
  auVar207._4_4_ = (uint)fVar227 & uVar44;
  auVar207._8_4_ = (uint)fVar230 & uVar45;
  auVar207._12_4_ = (uint)fVar233 & uVar47;
  auVar143._0_4_ = ~uVar43 & (uint)fVar112;
  auVar143._4_4_ = ~uVar44 & (uint)fVar50;
  auVar143._8_4_ = ~uVar45 & (uint)fVar83;
  auVar143._12_4_ = ~uVar47 & (uint)fVar85;
  auVar143 = auVar143 | auVar207;
  uVar43 = -(uint)(fVar112 <= ABS(fVar180));
  uVar44 = -(uint)(fVar50 <= ABS(fVar198));
  uVar45 = -(uint)(fVar83 <= ABS(fVar199));
  uVar47 = -(uint)(fVar85 <= ABS(fVar88));
  auVar193._0_4_ = (uint)fVar180 & uVar43;
  auVar193._4_4_ = (uint)fVar198 & uVar44;
  auVar193._8_4_ = (uint)fVar199 & uVar45;
  auVar193._12_4_ = (uint)fVar88 & uVar47;
  auVar174._0_4_ = ~uVar43 & (uint)fVar112;
  auVar174._4_4_ = ~uVar44 & (uint)fVar50;
  auVar174._8_4_ = ~uVar45 & (uint)fVar83;
  auVar174._12_4_ = ~uVar47 & (uint)fVar85;
  auVar174 = auVar174 | auVar193;
  auVar62 = rcpps(_DAT_01ff1d40,auVar128);
  fVar112 = auVar62._0_4_;
  fVar85 = auVar62._4_4_;
  fVar115 = auVar62._8_4_;
  fVar127 = auVar62._12_4_;
  fVar112 = (1.0 - auVar128._0_4_ * fVar112) * fVar112 + fVar112;
  fVar85 = (1.0 - auVar128._4_4_ * fVar85) * fVar85 + fVar85;
  fVar115 = (1.0 - auVar128._8_4_ * fVar115) * fVar115 + fVar115;
  fVar127 = (1.0 - auVar128._12_4_ * fVar127) * fVar127 + fVar127;
  auVar62 = rcpps(auVar62,auVar143);
  fVar50 = auVar62._0_4_;
  fVar88 = auVar62._4_4_;
  fVar124 = auVar62._8_4_;
  fVar140 = auVar62._12_4_;
  fVar50 = (1.0 - auVar143._0_4_ * fVar50) * fVar50 + fVar50;
  fVar88 = (1.0 - auVar143._4_4_ * fVar88) * fVar88 + fVar88;
  fVar124 = (1.0 - auVar143._8_4_ * fVar124) * fVar124 + fVar124;
  fVar140 = (1.0 - auVar143._12_4_ * fVar140) * fVar140 + fVar140;
  auVar62 = rcpps(auVar62,auVar174);
  fVar83 = auVar62._0_4_;
  fVar110 = auVar62._4_4_;
  fVar125 = auVar62._8_4_;
  fVar141 = auVar62._12_4_;
  fVar83 = (1.0 - auVar174._0_4_ * fVar83) * fVar83 + fVar83;
  fVar110 = (1.0 - auVar174._4_4_ * fVar110) * fVar110 + fVar110;
  fVar125 = (1.0 - auVar174._8_4_ * fVar125) * fVar125 + fVar125;
  fVar141 = (1.0 - auVar174._12_4_ * fVar141) * fVar141 + fVar141;
  uVar42 = *(ulong *)(prim + uVar37 * 7 + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar42;
  auVar65._12_2_ = uVar82;
  auVar65._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar42;
  auVar64._10_2_ = uVar82;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar82;
  auVar63._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar22._4_8_ = auVar63._8_8_;
  auVar22._2_2_ = uVar82;
  auVar22._0_2_ = uVar82;
  auVar129._0_8_ =
       CONCAT44(((float)(auVar22._0_4_ >> 0x10) - fVar165) * fVar85,
                ((float)(int)(short)uVar42 - fVar116) * fVar112);
  auVar129._8_4_ = ((float)(auVar63._8_4_ >> 0x10) - fVar167) * fVar115;
  auVar129._12_4_ = ((float)(auVar64._12_4_ >> 0x10) - fVar126) * fVar127;
  uVar42 = *(ulong *)(prim + uVar37 * 9 + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar42;
  auVar68._12_2_ = uVar82;
  auVar68._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar42;
  auVar67._10_2_ = uVar82;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar82;
  auVar66._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar23._4_8_ = auVar66._8_8_;
  auVar23._2_2_ = uVar82;
  auVar23._0_2_ = uVar82;
  auVar175._0_4_ = ((float)(int)(short)uVar42 - fVar116) * fVar112;
  auVar175._4_4_ = ((float)(auVar23._0_4_ >> 0x10) - fVar165) * fVar85;
  auVar175._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar167) * fVar115;
  auVar175._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar126) * fVar127;
  lVar33 = uVar41 + uVar37;
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  uVar41 = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar37 * -2 + 6);
  uVar82 = (undefined2)(uVar41 >> 0x30);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar41;
  auVar196._12_2_ = uVar82;
  auVar196._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar41 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar41;
  auVar195._10_2_ = uVar82;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar82;
  auVar194._0_8_ = uVar41;
  uVar82 = (undefined2)(uVar41 >> 0x10);
  auVar24._4_8_ = auVar194._8_8_;
  auVar24._2_2_ = uVar82;
  auVar24._0_2_ = uVar82;
  auVar197._0_8_ =
       CONCAT44(((float)(auVar24._0_4_ >> 0x10) - fVar178) * fVar88,
                ((float)(int)(short)uVar41 - fVar170) * fVar50);
  auVar197._8_4_ = ((float)(auVar194._8_4_ >> 0x10) - fVar179) * fVar124;
  auVar197._12_4_ = ((float)(auVar195._12_4_ >> 0x10) - fVar210) * fVar140;
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar42;
  auVar71._12_2_ = uVar82;
  auVar71._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar42;
  auVar70._10_2_ = uVar82;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar82;
  auVar69._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar25._4_8_ = auVar69._8_8_;
  auVar25._2_2_ = uVar82;
  auVar25._0_2_ = uVar82;
  auVar72._0_4_ = ((float)(int)(short)uVar42 - fVar170) * fVar50;
  auVar72._4_4_ = ((float)(auVar25._0_4_ >> 0x10) - fVar178) * fVar88;
  auVar72._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar179) * fVar124;
  auVar72._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar210) * fVar140;
  uVar42 = *(ulong *)(prim + lVar33 + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar42;
  auVar158._12_2_ = uVar82;
  auVar158._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar42;
  auVar157._10_2_ = uVar82;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._8_2_ = uVar82;
  auVar156._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar26._4_8_ = auVar156._8_8_;
  auVar26._2_2_ = uVar82;
  auVar26._0_2_ = uVar82;
  auVar159._0_8_ =
       CONCAT44(((float)(auVar26._0_4_ >> 0x10) - fVar152) * fVar110,
                ((float)(int)(short)uVar42 - fVar142) * fVar83);
  auVar159._8_4_ = ((float)(auVar156._8_4_ >> 0x10) - fVar153) * fVar125;
  auVar159._12_4_ = ((float)(auVar157._12_4_ >> 0x10) - fVar154) * fVar141;
  uVar42 = *(ulong *)(prim + uVar37 * 0x17 + 6);
  uVar82 = (undefined2)(uVar42 >> 0x30);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar42;
  auVar203._12_2_ = uVar82;
  auVar203._14_2_ = uVar82;
  uVar82 = (undefined2)(uVar42 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar42;
  auVar202._10_2_ = uVar82;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar82;
  auVar201._0_8_ = uVar42;
  uVar82 = (undefined2)(uVar42 >> 0x10);
  auVar27._4_8_ = auVar201._8_8_;
  auVar27._2_2_ = uVar82;
  auVar27._0_2_ = uVar82;
  auVar204._0_4_ = ((float)(int)(short)uVar42 - fVar142) * fVar83;
  auVar204._4_4_ = ((float)(auVar27._0_4_ >> 0x10) - fVar152) * fVar110;
  auVar204._8_4_ = ((float)(auVar201._8_4_ >> 0x10) - fVar153) * fVar125;
  auVar204._12_4_ = ((float)(auVar202._12_4_ >> 0x10) - fVar154) * fVar141;
  auVar211._8_4_ = auVar129._8_4_;
  auVar211._0_8_ = auVar129._0_8_;
  auVar211._12_4_ = auVar129._12_4_;
  auVar212 = minps(auVar211,auVar175);
  auVar90._8_4_ = auVar197._8_4_;
  auVar90._0_8_ = auVar197._0_8_;
  auVar90._12_4_ = auVar197._12_4_;
  auVar62 = minps(auVar90,auVar72);
  auVar212 = maxps(auVar212,auVar62);
  auVar91._8_4_ = auVar159._8_4_;
  auVar91._0_8_ = auVar159._0_8_;
  auVar91._12_4_ = auVar159._12_4_;
  auVar62 = minps(auVar91,auVar204);
  uVar36 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar144._4_4_ = uVar36;
  auVar144._0_4_ = uVar36;
  auVar144._8_4_ = uVar36;
  auVar144._12_4_ = uVar36;
  auVar62 = maxps(auVar62,auVar144);
  auVar62 = maxps(auVar212,auVar62);
  local_48 = auVar62._0_4_ * 0.99999964;
  fStack_44 = auVar62._4_4_ * 0.99999964;
  fStack_40 = auVar62._8_4_ * 0.99999964;
  fStack_3c = auVar62._12_4_ * 0.99999964;
  auVar62 = maxps(auVar129,auVar175);
  auVar212 = maxps(auVar197,auVar72);
  auVar62 = minps(auVar62,auVar212);
  auVar212 = maxps(auVar159,auVar204);
  fVar112 = (ray->super_RayK<1>).tfar;
  auVar73._4_4_ = fVar112;
  auVar73._0_4_ = fVar112;
  auVar73._8_4_ = fVar112;
  auVar73._12_4_ = fVar112;
  auVar212 = minps(auVar212,auVar73);
  auVar62 = minps(auVar62,auVar212);
  auVar92._0_4_ = -(uint)(PVar7 != (Primitive)0x0 && local_48 <= auVar62._0_4_ * 1.0000004);
  auVar92._4_4_ = -(uint)(1 < (byte)PVar7 && fStack_44 <= auVar62._4_4_ * 1.0000004);
  auVar92._8_4_ = -(uint)(2 < (byte)PVar7 && fStack_40 <= auVar62._8_4_ * 1.0000004);
  auVar92._12_4_ = -(uint)(3 < (byte)PVar7 && fStack_3c <= auVar62._12_4_ * 1.0000004);
  uVar43 = movmskps((int)lVar33,auVar92);
  if (uVar43 != 0) {
    uVar43 = uVar43 & 0xff;
    local_2e8 = mm_lookupmask_ps._0_8_;
    uStack_2e0 = mm_lookupmask_ps._8_8_;
    do {
      uVar42 = (ulong)uVar43;
      local_418 = auVar238;
      local_43c._4_16_ = auVar207;
      local_43c._20_4_ = fVar218;
      local_43c._24_4_ = fVar219;
      local_43c._28_4_ = fVar220;
      fStack_41c = fVar221;
      lVar33 = 0;
      if (uVar42 != 0) {
        for (; (uVar43 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
        }
      }
      uVar42 = uVar42 - 1 & uVar42;
      uVar43 = *(uint *)(prim + 2);
      uVar44 = *(uint *)(prim + lVar33 * 4 + 6);
      local_3a0 = (ulong)uVar43;
      pGVar9 = (context->scene->geometries).items[uVar43].ptr;
      _Var10 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_350 = (ulong)uVar44;
      uVar41 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 + _Var10 * uVar44);
      p_Var39 = pGVar9[1].intersectionFilterN;
      lVar33 = *(long *)&pGVar9[1].time_range.upper;
      pfVar1 = (float *)(lVar33 + (long)p_Var39 * uVar41);
      local_338 = *pfVar1;
      fStack_334 = pfVar1[1];
      fStack_330 = pfVar1[2];
      fStack_32c = pfVar1[3];
      pfVar2 = (float *)(lVar33 + (uVar41 + 1) * (long)p_Var39);
      fVar112 = *pfVar2;
      fVar50 = pfVar2[1];
      fVar83 = pfVar2[2];
      fStack_2ac = pfVar2[3];
      pauVar3 = (undefined1 (*) [16])(lVar33 + (uVar41 + 2) * (long)p_Var39);
      local_2c8 = *(float *)*pauVar3;
      fStack_2c4 = *(float *)(*pauVar3 + 4);
      fStack_2c0 = *(float *)(*pauVar3 + 8);
      fStack_2bc = *(float *)(*pauVar3 + 0xc);
      lVar40 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
        }
      }
      pauVar4 = (undefined1 (*) [16])(lVar33 + (uVar41 + 3) * (long)p_Var39);
      local_1f8 = *(float *)*pauVar4;
      fStack_1f4 = *(float *)(*pauVar4 + 4);
      fStack_1f0 = *(float *)(*pauVar4 + 8);
      fStack_1ec = *(float *)(*pauVar4 + 0xc);
      if ((uVar42 != 0) && (uVar41 = uVar42 - 1 & uVar42, uVar41 != 0)) {
        lVar33 = 0;
        if (uVar41 != 0) {
          for (; (uVar41 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
          }
        }
        p_Var39 = (RTCFilterFunctionN)
                  ((long)p_Var39 *
                  (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                                  _Var10 * *(uint *)(prim + lVar33 * 4 + 6)));
      }
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar85 = (ray->super_RayK<1>).org.field_0.m128[0];
      fVar88 = (ray->super_RayK<1>).org.field_0.m128[1];
      fVar110 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar154 = local_338 - fVar85;
      fVar116 = fStack_334 - fVar88;
      fVar165 = fStack_330 - fVar110;
      fVar115 = (pre->ray_space).vx.field_0.m128[0];
      fVar124 = (pre->ray_space).vx.field_0.m128[1];
      fVar125 = (pre->ray_space).vx.field_0.m128[2];
      fVar127 = (pre->ray_space).vy.field_0.m128[0];
      fVar140 = (pre->ray_space).vy.field_0.m128[1];
      fVar141 = (pre->ray_space).vy.field_0.m128[2];
      fVar142 = (pre->ray_space).vz.field_0.m128[0];
      fVar152 = (pre->ray_space).vz.field_0.m128[1];
      fVar153 = (pre->ray_space).vz.field_0.m128[2];
      local_1e8 = fVar154 * fVar115 + fVar116 * fVar127 + fVar165 * fVar142;
      local_178 = fVar154 * fVar124 + fVar116 * fVar140 + fVar165 * fVar152;
      local_388 = fVar154 * fVar125 + fVar116 * fVar141 + fVar165 * fVar153;
      fVar154 = fVar112 - fVar85;
      fVar116 = fVar50 - fVar88;
      fVar165 = fVar83 - fVar110;
      local_268 = fVar154 * fVar115 + fVar116 * fVar127 + fVar165 * fVar142;
      local_3c8 = fVar154 * fVar124 + fVar116 * fVar140 + fVar165 * fVar152;
      local_298 = fVar154 * fVar125 + fVar116 * fVar141 + fVar165 * fVar153;
      fVar165 = local_2c8 - fVar85;
      fVar167 = fStack_2c4 - fVar88;
      fVar126 = fStack_2c0 - fVar110;
      fVar154 = fVar165 * fVar115 + fVar167 * fVar127 + fVar126 * fVar142;
      fVar116 = fVar165 * fVar124 + fVar167 * fVar140 + fVar126 * fVar152;
      local_1d8 = fVar165 * fVar125 + fVar167 * fVar141 + fVar126 * fVar153;
      fVar85 = local_1f8 - fVar85;
      fVar88 = fStack_1f4 - fVar88;
      fVar110 = fStack_1f0 - fVar110;
      local_348 = fVar85 * fVar115 + fVar88 * fVar127 + fVar110 * fVar142;
      local_248 = fVar85 * fVar124 + fVar88 * fVar140 + fVar110 * fVar152;
      local_258 = fVar85 * fVar125 + fVar88 * fVar141 + fVar110 * fVar153;
      auVar239._0_8_ = CONCAT44(local_178,local_1e8) & 0x7fffffff7fffffff;
      auVar239._8_4_ = ABS(local_388);
      auVar239._12_4_ = ABS(fStack_32c);
      auVar145._0_8_ = CONCAT44(local_3c8,local_268) & 0x7fffffff7fffffff;
      auVar145._8_4_ = ABS(local_298);
      auVar145._12_4_ = ABS(fStack_2ac);
      auVar212 = maxps(auVar239,auVar145);
      auVar160._0_8_ = CONCAT44(fVar116,fVar154) & 0x7fffffff7fffffff;
      auVar160._8_4_ = ABS(local_1d8);
      auVar160._12_4_ = ABS(fStack_2bc);
      auVar93._0_8_ = CONCAT44(local_248,local_348) & 0x7fffffff7fffffff;
      auVar93._8_4_ = ABS(local_258);
      auVar93._12_4_ = ABS(fStack_1ec);
      auVar62 = maxps(auVar160,auVar93);
      auVar62 = maxps(auVar212,auVar62);
      fVar85 = auVar62._4_4_;
      if (auVar62._4_4_ <= auVar62._0_4_) {
        fVar85 = auVar62._0_4_;
      }
      auVar240._8_8_ = auVar62._8_8_;
      auVar240._0_8_ = auVar62._8_8_;
      fVar88 = (float)iVar8;
      if (auVar62._8_4_ <= fVar85) {
        auVar240._0_4_ = fVar85;
      }
      _local_208 = ZEXT416((uint)fVar88);
      lVar33 = (long)iVar8 * 0x44;
      fVar85 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar33 + 0x908);
      fVar110 = *(float *)(catmullrom_basis0 + lVar33 + 0x90c);
      fVar115 = *(float *)(catmullrom_basis0 + lVar33 + 0x910);
      auVar14 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar33 + 0x908);
      fVar124 = *(float *)(catmullrom_basis0 + lVar33 + 0x914);
      local_3f8 = fVar154;
      fStack_3f4 = fVar154;
      auStack_3f0[0] = (uint)fVar154;
      auStack_3ec[0] = (uint)fVar154;
      local_398 = fVar116;
      fStack_394 = fVar116;
      fStack_390 = fVar116;
      fStack_38c = fVar116;
      fVar125 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar33 + 0xd8c);
      fVar127 = *(float *)(catmullrom_basis0 + lVar33 + 0xd90);
      fVar140 = *(float *)(catmullrom_basis0 + lVar33 + 0xd94);
      auVar13 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar33 + 0xd8c);
      fVar141 = *(float *)(catmullrom_basis0 + lVar33 + 0xd98);
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      local_168 = fStack_2bc;
      fStack_164 = fStack_2bc;
      fStack_160 = fStack_2bc;
      fStack_15c = fStack_2bc;
      local_278 = *(float *)(catmullrom_basis0 + lVar33 + 0x484);
      fStack_274 = *(float *)(catmullrom_basis0 + lVar33 + 0x488);
      fStack_270 = *(float *)(catmullrom_basis0 + lVar33 + 0x48c);
      fStack_26c = *(float *)(catmullrom_basis0 + lVar33 + 0x490);
      local_2b8 = fVar112;
      fStack_2b4 = fVar50;
      fStack_2b0 = fVar83;
      local_1a8 = *(float *)(catmullrom_basis0 + lVar33);
      fStack_1a4 = *(float *)(catmullrom_basis0 + lVar33 + 4);
      fStack_1a0 = *(float *)(catmullrom_basis0 + lVar33 + 8);
      fStack_19c = *(float *)(catmullrom_basis0 + lVar33 + 0xc);
      local_198 = local_1e8 * local_1a8 +
                  local_268 * local_278 + fVar154 * fVar85 + local_348 * fVar125;
      fStack_194 = local_1e8 * fStack_1a4 +
                   local_268 * fStack_274 + fVar154 * fVar110 + local_348 * fVar127;
      fStack_190 = local_1e8 * fStack_1a0 +
                   local_268 * fStack_270 + fVar154 * fVar115 + local_348 * fVar140;
      fStack_18c = local_1e8 * fStack_19c +
                   local_268 * fStack_26c + fVar154 * fVar124 + local_348 * fVar141;
      local_188 = local_178 * local_1a8 +
                  local_3c8 * local_278 + fVar116 * fVar85 + local_248 * fVar125;
      fStack_184 = local_178 * fStack_1a4 +
                   local_3c8 * fStack_274 + fVar116 * fVar110 + local_248 * fVar127;
      fStack_180 = local_178 * fStack_1a0 +
                   local_3c8 * fStack_270 + fVar116 * fVar115 + local_248 * fVar140;
      fStack_17c = local_178 * fStack_19c +
                   local_3c8 * fStack_26c + fVar116 * fVar124 + local_248 * fVar141;
      local_368._0_4_ =
           fStack_32c * local_1a8 +
           fStack_2ac * local_278 + fStack_2bc * fVar85 + fStack_1ec * fVar125;
      local_368._4_4_ =
           fStack_32c * fStack_1a4 +
           fStack_2ac * fStack_274 + fStack_2bc * fVar110 + fStack_1ec * fVar127;
      uStack_360._0_4_ =
           fStack_32c * fStack_1a0 +
           fStack_2ac * fStack_270 + fStack_2bc * fVar115 + fStack_1ec * fVar140;
      uStack_360._4_4_ =
           fStack_32c * fStack_19c +
           fStack_2ac * fStack_26c + fStack_2bc * fVar124 + fStack_1ec * fVar141;
      fVar110 = *(float *)(catmullrom_basis1 + lVar33 + 0xd8c);
      fVar115 = *(float *)(catmullrom_basis1 + lVar33 + 0xd90);
      fVar125 = *(float *)(catmullrom_basis1 + lVar33 + 0xd94);
      fVar127 = *(float *)(catmullrom_basis1 + lVar33 + 0xd98);
      fStack_344 = local_348;
      fStack_340 = local_348;
      fStack_33c = local_348;
      fVar140 = *(float *)(catmullrom_basis1 + lVar33 + 0x908);
      fVar142 = *(float *)(catmullrom_basis1 + lVar33 + 0x90c);
      fVar152 = *(float *)(catmullrom_basis1 + lVar33 + 0x910);
      fVar153 = *(float *)(catmullrom_basis1 + lVar33 + 0x914);
      local_78 = fStack_1ec;
      fStack_74 = fStack_1ec;
      fStack_70 = fStack_1ec;
      fStack_6c = fStack_1ec;
      fVar165 = *(float *)(catmullrom_basis1 + lVar33 + 0x484);
      fVar167 = *(float *)(catmullrom_basis1 + lVar33 + 0x488);
      fVar126 = *(float *)(catmullrom_basis1 + lVar33 + 0x48c);
      fVar170 = *(float *)(catmullrom_basis1 + lVar33 + 0x490);
      fStack_264 = local_268;
      fStack_260 = local_268;
      fStack_25c = local_268;
      fStack_3c4 = local_3c8;
      fStack_3c0 = local_3c8;
      fStack_3bc = local_3c8;
      local_88 = fStack_2ac;
      fStack_84 = fStack_2ac;
      fStack_80 = fStack_2ac;
      fStack_7c = fStack_2ac;
      fVar178 = *(float *)(catmullrom_basis1 + lVar33);
      fVar179 = *(float *)(catmullrom_basis1 + lVar33 + 4);
      fVar180 = *(float *)(catmullrom_basis1 + lVar33 + 8);
      fVar198 = *(float *)(catmullrom_basis1 + lVar33 + 0xc);
      fStack_1e4 = local_1e8;
      fStack_1e0 = local_1e8;
      fStack_1dc = local_1e8;
      local_2d8._0_4_ =
           local_1e8 * fVar178 + local_268 * fVar165 + fVar154 * fVar140 + local_348 * fVar110;
      local_2d8._4_4_ =
           local_1e8 * fVar179 + local_268 * fVar167 + fVar154 * fVar142 + local_348 * fVar115;
      uStack_2d0._0_4_ =
           local_1e8 * fVar180 + local_268 * fVar126 + fVar154 * fVar152 + local_348 * fVar125;
      uStack_2d0._4_4_ =
           local_1e8 * fVar198 + local_268 * fVar170 + fVar154 * fVar153 + local_348 * fVar127;
      fStack_174 = local_178;
      fStack_170 = local_178;
      fStack_16c = local_178;
      fVar210 = local_178 * fVar178 + local_3c8 * fVar165 + fVar116 * fVar140 + local_248 * fVar110;
      fVar214 = local_178 * fVar179 + local_3c8 * fVar167 + fVar116 * fVar142 + local_248 * fVar115;
      fVar215 = local_178 * fVar180 + local_3c8 * fVar126 + fVar116 * fVar152 + local_248 * fVar125;
      fVar222 = local_178 * fVar198 + local_3c8 * fVar170 + fVar116 * fVar153 + local_248 * fVar127;
      local_98 = fStack_32c;
      fStack_94 = fStack_32c;
      fStack_90 = fStack_32c;
      fStack_8c = fStack_32c;
      local_3e8._0_4_ =
           fStack_32c * fVar178 + fStack_2ac * fVar165 + fStack_2bc * fVar140 + fStack_1ec * fVar110
      ;
      local_3e8._4_4_ =
           fStack_32c * fVar179 + fStack_2ac * fVar167 + fStack_2bc * fVar142 + fStack_1ec * fVar115
      ;
      uStack_3e0._0_4_ =
           fStack_32c * fVar180 + fStack_2ac * fVar126 + fStack_2bc * fVar152 + fStack_1ec * fVar125
      ;
      uStack_3e0._4_4_ =
           fStack_32c * fVar198 + fStack_2ac * fVar170 + fStack_2bc * fVar153 + fStack_1ec * fVar127
      ;
      fVar245 = (float)local_2d8._0_4_ - local_198;
      fVar247 = (float)local_2d8._4_4_ - fStack_194;
      fVar249 = (float)uStack_2d0 - fStack_190;
      fVar251 = uStack_2d0._4_4_ - fStack_18c;
      fVar227 = fVar210 - local_188;
      fVar230 = fVar214 - fStack_184;
      fVar233 = fVar215 - fStack_180;
      fVar236 = fVar222 - fStack_17c;
      fVar85 = local_188 * fVar245 - local_198 * fVar227;
      fVar199 = fStack_184 * fVar247 - fStack_194 * fVar230;
      fVar200 = fStack_180 * fVar249 - fStack_190 * fVar233;
      fVar208 = fStack_17c * fVar251 - fStack_18c * fVar236;
      auVar62 = maxps(_local_368,_local_3e8);
      bVar30 = fVar85 * fVar85 <=
               auVar62._0_4_ * auVar62._0_4_ * (fVar245 * fVar245 + fVar227 * fVar227) &&
               0.0 < fVar88;
      auVar130._0_4_ = -(uint)bVar30;
      bVar31 = fVar199 * fVar199 <=
               auVar62._4_4_ * auVar62._4_4_ * (fVar247 * fVar247 + fVar230 * fVar230) &&
               1.0 < fVar88;
      auVar130._4_4_ = -(uint)bVar31;
      bVar29 = fVar200 * fVar200 <=
               auVar62._8_4_ * auVar62._8_4_ * (fVar249 * fVar249 + fVar233 * fVar233) &&
               2.0 < fVar88;
      auVar130._8_4_ = -(uint)bVar29;
      bVar28 = 3.0 < fVar88 &&
               fVar208 * fVar208 <=
               auVar62._12_4_ * auVar62._12_4_ * (fVar251 * fVar251 + fVar236 * fVar236);
      auVar130._12_4_ = -(uint)bVar28;
      local_288 = auVar240._0_4_;
      fStack_284 = auVar240._4_4_;
      fStack_280 = auVar240._8_4_;
      fStack_27c = auVar240._12_4_;
      local_288 = local_288 * 4.7683716e-07;
      iVar32 = movmskps(iVar8,auVar130);
      fVar85 = (ray->super_RayK<1>).org.field_0.m128[3];
      _local_2a8 = ZEXT416((uint)fVar85);
      fStack_384 = local_388;
      fStack_380 = local_388;
      fStack_37c = local_388;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      fStack_1d4 = local_1d8;
      fStack_1d0 = local_1d8;
      fStack_1cc = local_1d8;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      fVar199 = fVar154;
      auVar216[0] = (uint)fVar154;
      auVar217[0] = (uint)fVar154;
      fVar200 = fVar116;
      fVar208 = fVar116;
      fVar209 = fVar116;
      if (iVar32 == 0) {
        uVar45 = 0;
      }
      else {
        local_408 = fVar110 * local_258 + fVar140 * local_1d8 + fVar165 * local_298 +
                    fVar178 * local_388;
        fStack_404 = fVar115 * local_258 + fVar142 * local_1d8 + fVar167 * local_298 +
                     fVar179 * local_388;
        fStack_400 = fVar125 * local_258 + fVar152 * local_1d8 + fVar126 * local_298 +
                     fVar180 * local_388;
        fStack_3fc = fVar127 * local_258 + fVar153 * local_1d8 + fVar170 * local_298 +
                     fVar198 * local_388;
        local_378._0_4_ = auVar14._0_4_;
        local_378._4_4_ = auVar14._4_4_;
        fStack_370 = auVar14._8_4_;
        local_3d8._0_4_ = auVar13._0_4_;
        local_3d8._4_4_ = auVar13._4_4_;
        fStack_3d0 = auVar13._8_4_;
        fVar155 = (float)local_3d8._0_4_ * local_258 + (float)local_378._0_4_ * local_1d8 +
                  local_278 * local_298 + local_1a8 * local_388;
        fVar166 = (float)local_3d8._4_4_ * local_258 + (float)local_378._4_4_ * local_1d8 +
                  fStack_274 * local_298 + fStack_1a4 * local_388;
        fVar168 = fStack_3d0 * local_258 + fStack_370 * local_1d8 + fStack_270 * local_298 +
                  fStack_1a0 * local_388;
        fVar169 = fVar141 * local_258 + fVar124 * local_1d8 + fStack_26c * local_298 +
                  fStack_19c * local_388;
        fVar110 = *(float *)(catmullrom_basis0 + lVar33 + 0x1210);
        fVar115 = *(float *)(catmullrom_basis0 + lVar33 + 0x1214);
        fVar124 = *(float *)(catmullrom_basis0 + lVar33 + 0x1218);
        fVar125 = *(float *)(catmullrom_basis0 + lVar33 + 0x121c);
        fVar127 = *(float *)(catmullrom_basis0 + lVar33 + 0x1694);
        fVar140 = *(float *)(catmullrom_basis0 + lVar33 + 0x1698);
        fVar141 = *(float *)(catmullrom_basis0 + lVar33 + 0x169c);
        fVar142 = *(float *)(catmullrom_basis0 + lVar33 + 0x16a0);
        fVar152 = *(float *)(catmullrom_basis0 + lVar33 + 0x1b18);
        fVar153 = *(float *)(catmullrom_basis0 + lVar33 + 0x1b1c);
        fVar165 = *(float *)(catmullrom_basis0 + lVar33 + 0x1b20);
        fVar167 = *(float *)(catmullrom_basis0 + lVar33 + 0x1b24);
        fVar126 = *(float *)(catmullrom_basis0 + lVar33 + 0x1f9c);
        fVar170 = *(float *)(catmullrom_basis0 + lVar33 + 0x1fa0);
        fVar178 = *(float *)(catmullrom_basis0 + lVar33 + 0x1fa4);
        fVar179 = *(float *)(catmullrom_basis0 + lVar33 + 0x1fa8);
        fVar223 = local_1e8 * fVar110 +
                  local_268 * fVar127 + fVar154 * fVar152 + local_348 * fVar126;
        fVar228 = local_1e8 * fVar115 +
                  local_268 * fVar140 + fVar154 * fVar153 + local_348 * fVar170;
        fVar231 = local_1e8 * fVar124 +
                  local_268 * fVar141 + fVar154 * fVar165 + local_348 * fVar178;
        fVar234 = local_1e8 * fVar125 +
                  local_268 * fVar142 + fVar154 * fVar167 + local_348 * fVar179;
        fVar267 = local_178 * fVar110 +
                  local_3c8 * fVar127 + fVar116 * fVar152 + local_248 * fVar126;
        fVar268 = local_178 * fVar115 +
                  local_3c8 * fVar140 + fVar116 * fVar153 + local_248 * fVar170;
        fVar269 = local_178 * fVar124 +
                  local_3c8 * fVar141 + fVar116 * fVar165 + local_248 * fVar178;
        fVar270 = local_178 * fVar125 +
                  local_3c8 * fVar142 + fVar116 * fVar167 + local_248 * fVar179;
        fVar180 = *(float *)(catmullrom_basis1 + lVar33 + 0x1210);
        fVar198 = *(float *)(catmullrom_basis1 + lVar33 + 0x1214);
        fVar256 = *(float *)(catmullrom_basis1 + lVar33 + 0x1218);
        fVar258 = *(float *)(catmullrom_basis1 + lVar33 + 0x121c);
        fVar224 = *(float *)(catmullrom_basis1 + lVar33 + 0x1b18);
        fVar229 = *(float *)(catmullrom_basis1 + lVar33 + 0x1b1c);
        fVar232 = *(float *)(catmullrom_basis1 + lVar33 + 0x1b20);
        fVar235 = *(float *)(catmullrom_basis1 + lVar33 + 0x1b24);
        fVar237 = *(float *)(catmullrom_basis1 + lVar33 + 0x1f9c);
        fVar246 = *(float *)(catmullrom_basis1 + lVar33 + 0x1fa0);
        fVar248 = *(float *)(catmullrom_basis1 + lVar33 + 0x1fa4);
        fVar250 = *(float *)(catmullrom_basis1 + lVar33 + 0x1fa8);
        fVar252 = *(float *)(catmullrom_basis1 + lVar33 + 0x1694);
        fVar257 = *(float *)(catmullrom_basis1 + lVar33 + 0x1698);
        fVar259 = *(float *)(catmullrom_basis1 + lVar33 + 0x169c);
        fVar260 = *(float *)(catmullrom_basis1 + lVar33 + 0x16a0);
        fVar261 = local_1e8 * fVar180 +
                  local_268 * fVar252 + fVar154 * fVar224 + local_348 * fVar237;
        fVar264 = local_1e8 * fVar198 +
                  local_268 * fVar257 + fVar154 * fVar229 + local_348 * fVar246;
        fVar265 = local_1e8 * fVar256 +
                  local_268 * fVar259 + fVar154 * fVar232 + local_348 * fVar248;
        fVar266 = local_1e8 * fVar258 +
                  local_268 * fVar260 + fVar154 * fVar235 + local_348 * fVar250;
        fVar89 = local_178 * fVar180 + local_3c8 * fVar252 + fVar116 * fVar224 + local_248 * fVar237
        ;
        fVar111 = local_178 * fVar198 +
                  local_3c8 * fVar257 + fVar116 * fVar229 + local_248 * fVar246;
        fVar113 = local_178 * fVar256 +
                  local_3c8 * fVar259 + fVar116 * fVar232 + local_248 * fVar248;
        fVar114 = local_178 * fVar258 +
                  local_3c8 * fVar260 + fVar116 * fVar235 + local_248 * fVar250;
        uVar51 = (uint)DAT_01fec6c0;
        uVar84 = DAT_01fec6c0._4_4_;
        uVar86 = DAT_01fec6c0._8_4_;
        uVar87 = DAT_01fec6c0._12_4_;
        auVar241._0_4_ = (uint)fVar223 & uVar51;
        auVar241._4_4_ = (uint)fVar228 & uVar84;
        auVar241._8_4_ = (uint)fVar231 & uVar86;
        auVar241._12_4_ = (uint)fVar234 & uVar87;
        auVar205._0_4_ = (uint)fVar267 & uVar51;
        auVar205._4_4_ = (uint)fVar268 & uVar84;
        auVar205._8_4_ = (uint)fVar269 & uVar86;
        auVar205._12_4_ = (uint)fVar270 & uVar87;
        auVar62 = maxps(auVar241,auVar205);
        auVar253._0_4_ =
             (uint)(fVar110 * local_388 +
                   fVar127 * local_298 + fVar152 * local_1d8 + fVar126 * local_258) & uVar51;
        auVar253._4_4_ =
             (uint)(fVar115 * local_388 +
                   fVar140 * local_298 + fVar153 * local_1d8 + fVar170 * local_258) & uVar84;
        auVar253._8_4_ =
             (uint)(fVar124 * local_388 +
                   fVar141 * local_298 + fVar165 * local_1d8 + fVar178 * local_258) & uVar86;
        auVar253._12_4_ =
             (uint)(fVar125 * local_388 +
                   fVar142 * local_298 + fVar167 * local_1d8 + fVar179 * local_258) & uVar87;
        auVar62 = maxps(auVar62,auVar253);
        uVar45 = -(uint)(local_288 <= auVar62._0_4_);
        uVar47 = -(uint)(local_288 <= auVar62._4_4_);
        uVar46 = -(uint)(local_288 <= auVar62._8_4_);
        uVar48 = -(uint)(local_288 <= auVar62._12_4_);
        fVar152 = (float)((uint)fVar223 & uVar45 | ~uVar45 & (uint)fVar245);
        fVar153 = (float)((uint)fVar228 & uVar47 | ~uVar47 & (uint)fVar247);
        fVar165 = (float)((uint)fVar231 & uVar46 | ~uVar46 & (uint)fVar249);
        fVar167 = (float)((uint)fVar234 & uVar48 | ~uVar48 & (uint)fVar251);
        fVar126 = (float)(~uVar45 & (uint)fVar227 | (uint)fVar267 & uVar45);
        fVar170 = (float)(~uVar47 & (uint)fVar230 | (uint)fVar268 & uVar47);
        fVar178 = (float)(~uVar46 & (uint)fVar233 | (uint)fVar269 & uVar46);
        fVar179 = (float)(~uVar48 & (uint)fVar236 | (uint)fVar270 & uVar48);
        auVar254._0_4_ = (uint)fVar261 & uVar51;
        auVar254._4_4_ = (uint)fVar264 & uVar84;
        auVar254._8_4_ = (uint)fVar265 & uVar86;
        auVar254._12_4_ = (uint)fVar266 & uVar87;
        auVar213._0_4_ = (uint)fVar89 & uVar51;
        auVar213._4_4_ = (uint)fVar111 & uVar84;
        auVar213._8_4_ = (uint)fVar113 & uVar86;
        auVar213._12_4_ = (uint)fVar114 & uVar87;
        auVar62 = maxps(auVar254,auVar213);
        auVar176._0_4_ =
             (uint)(fVar180 * local_388 +
                   fVar252 * local_298 + fVar224 * local_1d8 + fVar237 * local_258) & uVar51;
        auVar176._4_4_ =
             (uint)(fVar198 * local_388 +
                   fVar257 * local_298 + fVar229 * local_1d8 + fVar246 * local_258) & uVar84;
        auVar176._8_4_ =
             (uint)(fVar256 * local_388 +
                   fVar259 * local_298 + fVar232 * local_1d8 + fVar248 * local_258) & uVar86;
        auVar176._12_4_ =
             (uint)(fVar258 * local_388 +
                   fVar260 * local_298 + fVar235 * local_1d8 + fVar250 * local_258) & uVar87;
        auVar62 = maxps(auVar62,auVar176);
        uVar45 = -(uint)(local_288 <= auVar62._0_4_);
        uVar47 = -(uint)(local_288 <= auVar62._4_4_);
        uVar46 = -(uint)(local_288 <= auVar62._8_4_);
        uVar48 = -(uint)(local_288 <= auVar62._12_4_);
        fVar224 = (float)((uint)fVar261 & uVar45 | ~uVar45 & (uint)fVar245);
        fVar229 = (float)((uint)fVar264 & uVar47 | ~uVar47 & (uint)fVar247);
        fVar232 = (float)((uint)fVar265 & uVar46 | ~uVar46 & (uint)fVar249);
        fVar235 = (float)((uint)fVar266 & uVar48 | ~uVar48 & (uint)fVar251);
        fVar180 = (float)(~uVar45 & (uint)fVar227 | (uint)fVar89 & uVar45);
        fVar198 = (float)(~uVar47 & (uint)fVar230 | (uint)fVar111 & uVar47);
        fVar227 = (float)(~uVar46 & (uint)fVar233 | (uint)fVar113 & uVar46);
        fVar230 = (float)(~uVar48 & (uint)fVar236 | (uint)fVar114 & uVar48);
        auVar94._0_4_ = fVar126 * fVar126 + fVar152 * fVar152;
        auVar94._4_4_ = fVar170 * fVar170 + fVar153 * fVar153;
        auVar94._8_4_ = fVar178 * fVar178 + fVar165 * fVar165;
        auVar94._12_4_ = fVar179 * fVar179 + fVar167 * fVar167;
        auVar62 = rsqrtps(_DAT_01fec6c0,auVar94);
        fVar110 = auVar62._0_4_;
        fVar115 = auVar62._4_4_;
        fVar124 = auVar62._8_4_;
        fVar125 = auVar62._12_4_;
        auVar146._0_4_ = fVar110 * fVar110 * auVar94._0_4_ * 0.5 * fVar110;
        auVar146._4_4_ = fVar115 * fVar115 * auVar94._4_4_ * 0.5 * fVar115;
        auVar146._8_4_ = fVar124 * fVar124 * auVar94._8_4_ * 0.5 * fVar124;
        auVar146._12_4_ = fVar125 * fVar125 * auVar94._12_4_ * 0.5 * fVar125;
        fVar249 = fVar110 * 1.5 - auVar146._0_4_;
        fVar251 = fVar115 * 1.5 - auVar146._4_4_;
        fVar256 = fVar124 * 1.5 - auVar146._8_4_;
        fVar258 = fVar125 * 1.5 - auVar146._12_4_;
        auVar95._0_4_ = fVar180 * fVar180 + fVar224 * fVar224;
        auVar95._4_4_ = fVar198 * fVar198 + fVar229 * fVar229;
        auVar95._8_4_ = fVar227 * fVar227 + fVar232 * fVar232;
        auVar95._12_4_ = fVar230 * fVar230 + fVar235 * fVar235;
        auVar62 = rsqrtps(auVar146,auVar95);
        fVar110 = auVar62._0_4_;
        fVar115 = auVar62._4_4_;
        fVar124 = auVar62._8_4_;
        fVar125 = auVar62._12_4_;
        fVar127 = fVar110 * 1.5 - fVar110 * fVar110 * auVar95._0_4_ * 0.5 * fVar110;
        fVar140 = fVar115 * 1.5 - fVar115 * fVar115 * auVar95._4_4_ * 0.5 * fVar115;
        fVar141 = fVar124 * 1.5 - fVar124 * fVar124 * auVar95._8_4_ * 0.5 * fVar124;
        fVar142 = fVar125 * 1.5 - fVar125 * fVar125 * auVar95._12_4_ * 0.5 * fVar125;
        fVar233 = fVar126 * fVar249 * (float)local_368._0_4_;
        fVar236 = fVar170 * fVar251 * (float)local_368._4_4_;
        fVar245 = fVar178 * fVar256 * (float)uStack_360;
        fVar247 = fVar179 * fVar258 * uStack_360._4_4_;
        fVar110 = -fVar152 * fVar249 * (float)local_368._0_4_;
        fVar115 = -fVar153 * fVar251 * (float)local_368._4_4_;
        fVar124 = -fVar165 * fVar256 * (float)uStack_360;
        fVar125 = -fVar167 * fVar258 * uStack_360._4_4_;
        _local_3d8 = auVar130;
        fVar89 = fVar249 * 0.0 * (float)local_368._0_4_;
        fVar111 = fVar251 * 0.0 * (float)local_368._4_4_;
        fVar113 = fVar256 * 0.0 * (float)uStack_360;
        fVar114 = fVar258 * 0.0 * uStack_360._4_4_;
        local_378._0_4_ = fVar155 + fVar89;
        local_378._4_4_ = fVar166 + fVar111;
        fStack_370 = fVar168 + fVar113;
        fStack_36c = fVar169 + fVar114;
        fVar252 = fVar180 * fVar127 * (float)local_3e8._0_4_;
        fVar257 = fVar198 * fVar140 * (float)local_3e8._4_4_;
        fVar259 = fVar227 * fVar141 * (float)uStack_3e0;
        fVar260 = fVar230 * fVar142 * uStack_3e0._4_4_;
        fVar249 = (float)local_2d8._0_4_ + fVar252;
        fVar251 = (float)local_2d8._4_4_ + fVar257;
        fVar256 = (float)uStack_2d0 + fVar259;
        fVar258 = uStack_2d0._4_4_ + fVar260;
        fVar170 = -fVar224 * fVar127 * (float)local_3e8._0_4_;
        fVar179 = -fVar229 * fVar140 * (float)local_3e8._4_4_;
        fVar198 = -fVar232 * fVar141 * (float)uStack_3e0;
        fVar230 = -fVar235 * fVar142 * uStack_3e0._4_4_;
        fVar224 = fVar210 + fVar170;
        fVar229 = fVar214 + fVar179;
        fVar232 = fVar215 + fVar198;
        fVar235 = fVar222 + fVar230;
        fVar152 = fVar127 * 0.0 * (float)local_3e8._0_4_;
        fVar153 = fVar140 * 0.0 * (float)local_3e8._4_4_;
        fVar165 = fVar141 * 0.0 * (float)uStack_3e0;
        fVar167 = fVar142 * 0.0 * uStack_3e0._4_4_;
        fVar127 = local_198 - fVar233;
        fVar140 = fStack_194 - fVar236;
        fVar141 = fStack_190 - fVar245;
        fVar142 = fStack_18c - fVar247;
        fVar237 = local_408 + fVar152;
        fVar246 = fStack_404 + fVar153;
        fVar248 = fStack_400 + fVar165;
        fVar250 = fStack_3fc + fVar167;
        fVar126 = local_188 - fVar110;
        fVar178 = fStack_184 - fVar115;
        fVar180 = fStack_180 - fVar124;
        fVar227 = fStack_17c - fVar125;
        fVar155 = fVar155 - fVar89;
        fVar166 = fVar166 - fVar111;
        fVar168 = fVar168 - fVar113;
        fVar169 = fVar169 - fVar114;
        uVar45 = -(uint)(0.0 < (fVar126 * (fVar237 - fVar155) - fVar155 * (fVar224 - fVar126)) * 0.0
                               + (fVar155 * (fVar249 - fVar127) - (fVar237 - fVar155) * fVar127) *
                                 0.0 + ((fVar224 - fVar126) * fVar127 -
                                       (fVar249 - fVar127) * fVar126));
        uVar47 = -(uint)(0.0 < (fVar178 * (fVar246 - fVar166) - fVar166 * (fVar229 - fVar178)) * 0.0
                               + (fVar166 * (fVar251 - fVar140) - (fVar246 - fVar166) * fVar140) *
                                 0.0 + ((fVar229 - fVar178) * fVar140 -
                                       (fVar251 - fVar140) * fVar178));
        uVar46 = -(uint)(0.0 < (fVar180 * (fVar248 - fVar168) - fVar168 * (fVar232 - fVar180)) * 0.0
                               + (fVar168 * (fVar256 - fVar141) - (fVar248 - fVar168) * fVar141) *
                                 0.0 + ((fVar232 - fVar180) * fVar141 -
                                       (fVar256 - fVar141) * fVar180));
        uVar48 = -(uint)(0.0 < (fVar227 * (fVar250 - fVar169) - fVar169 * (fVar235 - fVar227)) * 0.0
                               + (fVar169 * (fVar258 - fVar142) - (fVar250 - fVar169) * fVar142) *
                                 0.0 + ((fVar235 - fVar227) * fVar142 -
                                       (fVar258 - fVar142) * fVar227));
        fVar233 = (float)((uint)((float)local_2d8._0_4_ - fVar252) & uVar45 |
                         ~uVar45 & (uint)(local_198 + fVar233));
        fVar236 = (float)((uint)((float)local_2d8._4_4_ - fVar257) & uVar47 |
                         ~uVar47 & (uint)(fStack_194 + fVar236));
        fVar245 = (float)((uint)((float)uStack_2d0 - fVar259) & uVar46 |
                         ~uVar46 & (uint)(fStack_190 + fVar245));
        fVar247 = (float)((uint)(uStack_2d0._4_4_ - fVar260) & uVar48 |
                         ~uVar48 & (uint)(fStack_18c + fVar247));
        fVar110 = (float)((uint)(fVar210 - fVar170) & uVar45 | ~uVar45 & (uint)(local_188 + fVar110)
                         );
        fVar115 = (float)((uint)(fVar214 - fVar179) & uVar47 |
                         ~uVar47 & (uint)(fStack_184 + fVar115));
        fVar124 = (float)((uint)(fVar215 - fVar198) & uVar46 |
                         ~uVar46 & (uint)(fStack_180 + fVar124));
        fVar125 = (float)((uint)(fVar222 - fVar230) & uVar48 |
                         ~uVar48 & (uint)(fStack_17c + fVar125));
        fVar89 = (float)((uint)(local_408 - fVar152) & uVar45 | ~uVar45 & local_378._0_4_);
        fVar111 = (float)((uint)(fStack_404 - fVar153) & uVar47 | ~uVar47 & local_378._4_4_);
        fVar113 = (float)((uint)(fStack_400 - fVar165) & uVar46 | ~uVar46 & (uint)fStack_370);
        fVar114 = (float)((uint)(fStack_3fc - fVar167) & uVar48 | ~uVar48 & (uint)fStack_36c);
        fVar152 = (float)((uint)fVar127 & uVar45 | ~uVar45 & (uint)fVar249);
        fVar153 = (float)((uint)fVar140 & uVar47 | ~uVar47 & (uint)fVar251);
        fVar165 = (float)((uint)fVar141 & uVar46 | ~uVar46 & (uint)fVar256);
        fVar167 = (float)((uint)fVar142 & uVar48 | ~uVar48 & (uint)fVar258);
        fVar170 = (float)((uint)fVar126 & uVar45 | ~uVar45 & (uint)fVar224);
        fVar179 = (float)((uint)fVar178 & uVar47 | ~uVar47 & (uint)fVar229);
        fVar198 = (float)((uint)fVar180 & uVar46 | ~uVar46 & (uint)fVar232);
        fVar210 = (float)((uint)fVar227 & uVar48 | ~uVar48 & (uint)fVar235);
        fVar214 = (float)((uint)fVar155 & uVar45 | ~uVar45 & (uint)fVar237);
        fVar215 = (float)((uint)fVar166 & uVar47 | ~uVar47 & (uint)fVar246);
        fVar222 = (float)((uint)fVar168 & uVar46 | ~uVar46 & (uint)fVar248);
        fVar230 = (float)((uint)fVar169 & uVar48 | ~uVar48 & (uint)fVar250);
        fVar249 = (float)((uint)fVar249 & uVar45 | ~uVar45 & (uint)fVar127) - fVar233;
        fVar251 = (float)((uint)fVar251 & uVar47 | ~uVar47 & (uint)fVar140) - fVar236;
        fVar256 = (float)((uint)fVar256 & uVar46 | ~uVar46 & (uint)fVar141) - fVar245;
        fVar258 = (float)((uint)fVar258 & uVar48 | ~uVar48 & (uint)fVar142) - fVar247;
        fVar224 = (float)((uint)fVar224 & uVar45 | ~uVar45 & (uint)fVar126) - fVar110;
        fVar229 = (float)((uint)fVar229 & uVar47 | ~uVar47 & (uint)fVar178) - fVar115;
        fVar232 = (float)((uint)fVar232 & uVar46 | ~uVar46 & (uint)fVar180) - fVar124;
        fVar235 = (float)((uint)fVar235 & uVar48 | ~uVar48 & (uint)fVar227) - fVar125;
        fVar237 = (float)((uint)fVar237 & uVar45 | ~uVar45 & (uint)fVar155) - fVar89;
        fVar246 = (float)((uint)fVar246 & uVar47 | ~uVar47 & (uint)fVar166) - fVar111;
        fVar248 = (float)((uint)fVar248 & uVar46 | ~uVar46 & (uint)fVar168) - fVar113;
        fVar250 = (float)((uint)fVar250 & uVar48 | ~uVar48 & (uint)fVar169) - fVar114;
        fVar155 = fVar233 - fVar152;
        fVar166 = fVar236 - fVar153;
        fVar168 = fVar245 - fVar165;
        fVar169 = fVar247 - fVar167;
        fVar126 = fVar110 - fVar170;
        fVar178 = fVar115 - fVar179;
        fVar180 = fVar124 - fVar198;
        fVar227 = fVar125 - fVar210;
        fVar127 = fVar89 - fVar214;
        fVar140 = fVar111 - fVar215;
        fVar141 = fVar113 - fVar222;
        fVar142 = fVar114 - fVar230;
        fVar252 = (fVar110 * fVar237 - fVar89 * fVar224) * 0.0 +
                  (fVar89 * fVar249 - fVar233 * fVar237) * 0.0 +
                  (fVar233 * fVar224 - fVar110 * fVar249);
        fVar257 = (fVar115 * fVar246 - fVar111 * fVar229) * 0.0 +
                  (fVar111 * fVar251 - fVar236 * fVar246) * 0.0 +
                  (fVar236 * fVar229 - fVar115 * fVar251);
        auVar131._4_4_ = fVar257;
        auVar131._0_4_ = fVar252;
        fVar259 = (fVar124 * fVar248 - fVar113 * fVar232) * 0.0 +
                  (fVar113 * fVar256 - fVar245 * fVar248) * 0.0 +
                  (fVar245 * fVar232 - fVar124 * fVar256);
        fVar260 = (fVar125 * fVar250 - fVar114 * fVar235) * 0.0 +
                  (fVar114 * fVar258 - fVar247 * fVar250) * 0.0 +
                  (fVar247 * fVar235 - fVar125 * fVar258);
        auVar262._0_4_ =
             (fVar170 * fVar127 - fVar214 * fVar126) * 0.0 +
             (fVar214 * fVar155 - fVar152 * fVar127) * 0.0 + (fVar152 * fVar126 - fVar170 * fVar155)
        ;
        auVar262._4_4_ =
             (fVar179 * fVar140 - fVar215 * fVar178) * 0.0 +
             (fVar215 * fVar166 - fVar153 * fVar140) * 0.0 + (fVar153 * fVar178 - fVar179 * fVar166)
        ;
        auVar262._8_4_ =
             (fVar198 * fVar141 - fVar222 * fVar180) * 0.0 +
             (fVar222 * fVar168 - fVar165 * fVar141) * 0.0 + (fVar165 * fVar180 - fVar198 * fVar168)
        ;
        auVar262._12_4_ =
             (fVar210 * fVar142 - fVar230 * fVar227) * 0.0 +
             (fVar230 * fVar169 - fVar167 * fVar142) * 0.0 + (fVar167 * fVar227 - fVar210 * fVar169)
        ;
        auVar131._8_4_ = fVar259;
        auVar131._12_4_ = fVar260;
        auVar62 = maxps(auVar131,auVar262);
        bVar30 = auVar62._0_4_ <= 0.0 && bVar30;
        auVar132._0_4_ = -(uint)bVar30;
        bVar31 = auVar62._4_4_ <= 0.0 && bVar31;
        auVar132._4_4_ = -(uint)bVar31;
        bVar29 = auVar62._8_4_ <= 0.0 && bVar29;
        auVar132._8_4_ = -(uint)bVar29;
        bVar28 = auVar62._12_4_ <= 0.0 && bVar28;
        auVar132._12_4_ = -(uint)bVar28;
        iVar32 = movmskps(iVar32,auVar132);
        if (iVar32 == 0) {
LAB_00b626dd:
          auVar133._8_8_ = uStack_2e0;
          auVar133._0_8_ = local_2e8;
        }
        else {
          fVar152 = (ray->super_RayK<1>).tfar;
          auVar147._0_4_ = fVar127 * fVar224;
          auVar147._4_4_ = fVar140 * fVar229;
          auVar147._8_4_ = fVar141 * fVar232;
          auVar147._12_4_ = fVar142 * fVar235;
          fVar170 = fVar126 * fVar237 - auVar147._0_4_;
          fVar179 = fVar178 * fVar246 - auVar147._4_4_;
          fVar198 = fVar180 * fVar248 - auVar147._8_4_;
          fVar210 = fVar227 * fVar250 - auVar147._12_4_;
          fVar127 = fVar127 * fVar249 - fVar237 * fVar155;
          fVar153 = fVar140 * fVar251 - fVar246 * fVar166;
          fVar165 = fVar141 * fVar256 - fVar248 * fVar168;
          fVar167 = fVar142 * fVar258 - fVar250 * fVar169;
          fVar214 = fVar155 * fVar224 - fVar126 * fVar249;
          fVar178 = fVar166 * fVar229 - fVar178 * fVar251;
          fVar180 = fVar168 * fVar232 - fVar180 * fVar256;
          fVar215 = fVar169 * fVar235 - fVar227 * fVar258;
          auVar161._0_4_ = fVar170 * 0.0 + fVar127 * 0.0 + fVar214;
          auVar161._4_4_ = fVar179 * 0.0 + fVar153 * 0.0 + fVar178;
          auVar161._8_4_ = fVar198 * 0.0 + fVar165 * 0.0 + fVar180;
          auVar161._12_4_ = fVar210 * 0.0 + fVar167 * 0.0 + fVar215;
          auVar62 = rcpps(auVar147,auVar161);
          fVar140 = auVar62._0_4_;
          fVar141 = auVar62._4_4_;
          fVar142 = auVar62._8_4_;
          fVar126 = auVar62._12_4_;
          fVar140 = (1.0 - auVar161._0_4_ * fVar140) * fVar140 + fVar140;
          fVar141 = (1.0 - auVar161._4_4_ * fVar141) * fVar141 + fVar141;
          fVar142 = (1.0 - auVar161._8_4_ * fVar142) * fVar142 + fVar142;
          fVar126 = (1.0 - auVar161._12_4_ * fVar126) * fVar126 + fVar126;
          fVar110 = (fVar89 * fVar214 + fVar110 * fVar127 + fVar233 * fVar170) * fVar140;
          fVar115 = (fVar111 * fVar178 + fVar115 * fVar153 + fVar236 * fVar179) * fVar141;
          auVar225._4_4_ = fVar115;
          auVar225._0_4_ = fVar110;
          fVar124 = (fVar113 * fVar180 + fVar124 * fVar165 + fVar245 * fVar198) * fVar142;
          fVar125 = (fVar114 * fVar215 + fVar125 * fVar167 + fVar247 * fVar210) * fVar126;
          bVar30 = (fVar110 <= fVar152 && fVar85 <= fVar110) && bVar30;
          auVar74._0_4_ = -(uint)bVar30;
          bVar31 = (fVar115 <= fVar152 && fVar85 <= fVar115) && bVar31;
          auVar74._4_4_ = -(uint)bVar31;
          bVar29 = (fVar124 <= fVar152 && fVar85 <= fVar124) && bVar29;
          auVar74._8_4_ = -(uint)bVar29;
          bVar28 = (fVar125 <= fVar152 && fVar85 <= fVar125) && bVar28;
          auVar74._12_4_ = -(uint)bVar28;
          iVar32 = movmskps(iVar32,auVar74);
          if (iVar32 == 0) goto LAB_00b626dd;
          auVar75._0_8_ =
               CONCAT44(-(uint)(auVar161._4_4_ != 0.0 && bVar31),
                        -(uint)(auVar161._0_4_ != 0.0 && bVar30));
          auVar75._8_4_ = -(uint)(auVar161._8_4_ != 0.0 && bVar29);
          auVar75._12_4_ = -(uint)(auVar161._12_4_ != 0.0 && bVar28);
          iVar32 = movmskps(iVar32,auVar75);
          auVar133._8_8_ = uStack_2e0;
          auVar133._0_8_ = local_2e8;
          if (iVar32 != 0) {
            fVar252 = fVar252 * fVar140;
            fVar257 = fVar257 * fVar141;
            fVar259 = fVar259 * fVar142;
            fVar260 = fVar260 * fVar126;
            fVar218 = (float)((uint)(1.0 - fVar252) & uVar45 | ~uVar45 & (uint)fVar252);
            fVar219 = (float)((uint)(1.0 - fVar257) & uVar47 | ~uVar47 & (uint)fVar257);
            fVar220 = (float)((uint)(1.0 - fVar259) & uVar46 | ~uVar46 & (uint)fVar259);
            fVar221 = (float)((uint)(1.0 - fVar260) & uVar48 | ~uVar48 & (uint)fVar260);
            auVar133._8_4_ = auVar75._8_4_;
            auVar133._0_8_ = auVar75._0_8_;
            auVar133._12_4_ = auVar75._12_4_;
            auVar225._8_4_ = fVar124;
            auVar225._12_4_ = fVar125;
            local_1b8 = (float)(~uVar45 & (uint)(auVar262._0_4_ * fVar140) |
                               (uint)(1.0 - auVar262._0_4_ * fVar140) & uVar45);
            fStack_1b4 = (float)(~uVar47 & (uint)(auVar262._4_4_ * fVar141) |
                                (uint)(1.0 - auVar262._4_4_ * fVar141) & uVar47);
            fStack_1b0 = (float)(~uVar46 & (uint)(auVar262._8_4_ * fVar142) |
                                (uint)(1.0 - auVar262._8_4_ * fVar142) & uVar46);
            fStack_1ac = (float)(~uVar48 & (uint)(auVar262._12_4_ * fVar126) |
                                (uint)(1.0 - auVar262._12_4_ * fVar126) & uVar48);
            auVar207 = auVar225;
          }
        }
        iVar32 = movmskps(iVar32,auVar133);
        if (iVar32 == 0) {
          uVar45 = 0;
        }
        else {
          fVar110 = ((float)local_3e8._0_4_ - (float)local_368._0_4_) * fVar218 +
                    (float)local_368._0_4_;
          fVar115 = ((float)local_3e8._4_4_ - (float)local_368._4_4_) * fVar219 +
                    (float)local_368._4_4_;
          fVar124 = ((float)uStack_3e0 - (float)uStack_360) * fVar220 + (float)uStack_360;
          fVar125 = (uStack_3e0._4_4_ - uStack_360._4_4_) * fVar221 + uStack_360._4_4_;
          fVar85 = pre->depth_scale;
          auVar76._0_4_ = -(uint)(fVar85 * (fVar110 + fVar110) < auVar207._0_4_) & auVar133._0_4_;
          auVar76._4_4_ = -(uint)(fVar85 * (fVar115 + fVar115) < auVar207._4_4_) & auVar133._4_4_;
          auVar76._8_4_ = -(uint)(fVar85 * (fVar124 + fVar124) < auVar207._8_4_) & auVar133._8_4_;
          auVar76._12_4_ = -(uint)(fVar85 * (fVar125 + fVar125) < auVar207._12_4_) & auVar133._12_4_
          ;
          uVar45 = movmskps(iVar32,auVar76);
          if (uVar45 != 0) {
            local_1b8 = local_1b8 + local_1b8 + -1.0;
            fStack_1b4 = fStack_1b4 + fStack_1b4 + -1.0;
            fStack_1b0 = fStack_1b0 + fStack_1b0 + -1.0;
            fStack_1ac = fStack_1ac + fStack_1ac + -1.0;
            local_158 = fVar218;
            fStack_154 = fVar219;
            fStack_150 = fVar220;
            fStack_14c = fVar221;
            local_148 = local_1b8;
            fStack_144 = fStack_1b4;
            fStack_140 = fStack_1b0;
            fStack_13c = fStack_1ac;
            local_138 = auVar207;
            local_128 = 0;
            local_124 = iVar8;
            local_118 = *(undefined8 *)pfVar1;
            uStack_110 = *(undefined8 *)(pfVar1 + 2);
            local_108 = fVar112;
            fStack_104 = fVar50;
            fStack_100 = fVar83;
            fStack_fc = fStack_2ac;
            local_f8 = local_2c8;
            fStack_f4 = fStack_2c4;
            fStack_f0 = fStack_2c0;
            fStack_ec = fStack_2bc;
            local_e8 = *(undefined8 *)*pauVar4;
            uStack_e0 = *(undefined8 *)(*pauVar4 + 8);
            local_d8 = auVar76;
            uVar45 = (ray->super_RayK<1>).mask;
            if ((pGVar9->mask & uVar45) != 0) {
              local_328 = auVar76;
              fVar88 = 1.0 / fVar88;
              local_c8[0] = fVar88 * (fVar218 + 0.0);
              local_c8[1] = fVar88 * (fVar219 + 1.0);
              local_c8[2] = fVar88 * (fVar220 + 2.0);
              local_c8[3] = fVar88 * (fVar221 + 3.0);
              local_b8 = CONCAT44(fStack_1b4,local_1b8);
              uStack_b0 = CONCAT44(fStack_1ac,fStack_1b0);
              local_a8 = auVar207;
              auVar96._0_4_ = auVar76._0_4_ & (uint)auVar207._0_4_;
              auVar96._4_4_ = auVar76._4_4_ & (uint)auVar207._4_4_;
              auVar96._8_4_ = auVar76._8_4_ & (uint)auVar207._8_4_;
              auVar96._12_4_ = auVar76._12_4_ & (uint)auVar207._12_4_;
              auVar117._0_8_ = CONCAT44(~auVar76._4_4_,~auVar76._0_4_) & 0x7f8000007f800000;
              auVar117._8_4_ = ~auVar76._8_4_ & 0x7f800000;
              auVar117._12_4_ = ~auVar76._12_4_ & 0x7f800000;
              auVar117 = auVar117 | auVar96;
              auVar134._4_4_ = auVar117._0_4_;
              auVar134._0_4_ = auVar117._4_4_;
              auVar134._8_4_ = auVar117._12_4_;
              auVar134._12_4_ = auVar117._8_4_;
              auVar62 = minps(auVar134,auVar117);
              auVar97._0_8_ = auVar62._8_8_;
              auVar97._8_4_ = auVar62._0_4_;
              auVar97._12_4_ = auVar62._4_4_;
              auVar62 = minps(auVar97,auVar62);
              auVar98._0_8_ =
                   CONCAT44(-(uint)(auVar62._4_4_ == auVar117._4_4_) & auVar76._4_4_,
                            -(uint)(auVar62._0_4_ == auVar117._0_4_) & auVar76._0_4_);
              auVar98._8_4_ = -(uint)(auVar62._8_4_ == auVar117._8_4_) & auVar76._8_4_;
              auVar98._12_4_ = -(uint)(auVar62._12_4_ == auVar117._12_4_) & auVar76._12_4_;
              iVar32 = movmskps(uVar45,auVar98);
              if (iVar32 != 0) {
                auVar76._8_4_ = auVar98._8_4_;
                auVar76._0_8_ = auVar98._0_8_;
                auVar76._12_4_ = auVar98._12_4_;
              }
              uVar45 = movmskps(iVar32,auVar76);
              lVar40 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar85 = local_c8[lVar40];
                fVar110 = 1.0 - fVar85;
                fVar88 = fVar85 * 3.0;
                fVar125 = ((fVar88 + 2.0) * (fVar110 + fVar110) + fVar110 * -3.0 * fVar110) * 0.5;
                fVar115 = (fVar110 * -2.0 * fVar85 + fVar85 * fVar85) * 0.5;
                fVar124 = (fVar85 * fVar88 + (fVar88 + -5.0) * (fVar85 + fVar85)) * 0.5;
                fVar88 = *(float *)((long)&local_b8 + lVar40 * 4);
                fVar110 = (fVar85 * (fVar110 + fVar110) - fVar110 * fVar110) * 0.5;
                (ray->super_RayK<1>).tfar = *(float *)(local_a8 + lVar40 * 4);
                *(ulong *)&(ray->Ng).field_0 =
                     CONCAT44(fVar110 * fStack_334 +
                              fVar124 * fVar50 + fVar125 * fStack_2c4 + fVar115 * fStack_1f4,
                              fVar110 * local_338 +
                              fVar124 * fVar112 + fVar125 * local_2c8 + fVar115 * local_1f8);
                (ray->Ng).field_0.field_0.z =
                     fVar110 * fStack_330 +
                     fVar124 * fVar83 + fVar125 * fStack_2c0 + fVar115 * fStack_1f0;
                ray->u = fVar85;
                ray->v = fVar88;
                ray->primID = uVar44;
                ray->geomID = uVar43;
                ray->instID[0] = context->user->instID[0];
                uVar45 = context->user->instPrimID[0];
                ray->instPrimID[0] = uVar45;
              }
              else {
                _local_3e8 = *pauVar3;
                _local_368 = *pauVar4;
                local_43c._20_4_ = fVar218;
                local_43c._24_4_ = fVar219;
                local_43c._28_4_ = fVar220;
                fStack_41c = fVar221;
                local_43c._4_16_ = auVar207;
                local_3a8 = prim;
                local_3b0 = context;
                local_3b8 = pre;
                do {
                  local_22c = local_c8[lVar40];
                  local_228 = *(undefined4 *)((long)&local_b8 + lVar40 * 4);
                  local_408 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_a8 + lVar40 * 4);
                  fVar85 = 1.0 - local_22c;
                  fVar110 = local_22c * 3.0;
                  fVar115 = ((fVar110 + 2.0) * (fVar85 + fVar85) + fVar85 * -3.0 * fVar85) * 0.5;
                  fVar88 = (fVar85 * -2.0 * local_22c + local_22c * local_22c) * 0.5;
                  fVar110 = (local_22c * fVar110 + (fVar110 + -5.0) * (local_22c + local_22c)) * 0.5
                  ;
                  fVar85 = (local_22c * (fVar85 + fVar85) - fVar85 * fVar85) * 0.5;
                  local_318.context = context->user;
                  local_238 = CONCAT44(fVar85 * fStack_334 +
                                       fVar110 * fVar50 +
                                       fVar115 * (float)local_3e8._4_4_ +
                                       fVar88 * (float)local_368._4_4_,
                                       fVar85 * local_338 +
                                       fVar110 * fVar112 +
                                       fVar115 * (float)local_3e8._0_4_ +
                                       fVar88 * (float)local_368._0_4_);
                  local_230 = fVar85 * fStack_330 +
                              fVar110 * fVar83 +
                              fVar115 * (float)uStack_3e0 + fVar88 * (float)uStack_360;
                  local_224 = (int)local_350;
                  local_220 = (int)local_3a0;
                  local_21c = (local_318.context)->instID[0];
                  local_218 = (local_318.context)->instPrimID[0];
                  local_43c._0_4_ = -NAN;
                  local_318.valid = (int *)local_43c;
                  pRVar38 = (RTCIntersectArguments *)pGVar9->userPtr;
                  local_318.geometryUserPtr = pRVar38;
                  local_318.ray = (RTCRayN *)ray;
                  local_318.hit = (RTCHitN *)&local_238;
                  local_318.N = 1;
                  if ((pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar9->intersectionFilterN)(&local_318), p_Var39 = extraout_RDX_01,
                     prim = local_3a8, context = local_3b0, pre = local_3b8,
                     auVar207 = local_43c._4_16_, auVar238 = local_418,
                     fVar218 = (float)local_43c._20_4_, fVar219 = (float)local_43c._24_4_,
                     fVar220 = (float)local_43c._28_4_, fVar221 = fStack_41c, fVar154 = local_3f8,
                     fVar199 = fStack_3f4, auVar216[0] = auStack_3f0[0],
                     auVar217[0] = auStack_3ec[0], fVar116 = local_398, fVar200 = fStack_394,
                     fVar208 = fStack_390, fVar209 = fStack_38c,
                     (((RayK<1> *)local_318.valid)->org).field_0.m128[0] != 0.0)) {
                    pRVar38 = context->args;
                    if (pRVar38->filter != (RTCFilterFunctionN)0x0) {
                      if (((pRVar38->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                        (*pRVar38->filter)(&local_318);
                        p_Var39 = extraout_RDX_02;
                        prim = local_3a8;
                        context = local_3b0;
                        pre = local_3b8;
                        auVar207 = local_43c._4_16_;
                        auVar238 = local_418;
                        fVar218 = (float)local_43c._20_4_;
                        fVar219 = (float)local_43c._24_4_;
                        fVar220 = (float)local_43c._28_4_;
                        fVar221 = fStack_41c;
                        fVar154 = local_3f8;
                        fVar199 = fStack_3f4;
                        auVar216[0] = auStack_3f0[0];
                        auVar217[0] = auStack_3ec[0];
                        fVar116 = local_398;
                        fVar200 = fStack_394;
                        fVar208 = fStack_390;
                        fVar209 = fStack_38c;
                      }
                      if ((((RayK<1> *)local_318.valid)->org).field_0.m128[0] == 0.0)
                      goto LAB_00b63acf;
                    }
                    (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_318.hit;
                    (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_318.hit + 4);
                    (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_318.hit + 8);
                    *(float *)((long)local_318.ray + 0x3c) = *(float *)(local_318.hit + 0xc);
                    *(float *)((long)local_318.ray + 0x40) = *(float *)(local_318.hit + 0x10);
                    *(float *)((long)local_318.ray + 0x44) = *(float *)(local_318.hit + 0x14);
                    *(float *)((long)local_318.ray + 0x48) = *(float *)(local_318.hit + 0x18);
                    p_Var39 = (RTCFilterFunctionN)(ulong)(uint)*(float *)(local_318.hit + 0x1c);
                    *(float *)((long)local_318.ray + 0x4c) = *(float *)(local_318.hit + 0x1c);
                    pRVar38 = (RTCIntersectArguments *)(ulong)(uint)*(float *)(local_318.hit + 0x20)
                    ;
                    *(float *)((long)local_318.ray + 0x50) = *(float *)(local_318.hit + 0x20);
                    pRVar35 = (RayHit *)local_318.ray;
                  }
                  else {
LAB_00b63acf:
                    (ray->super_RayK<1>).tfar = local_408;
                    pRVar35 = (RayHit *)local_318.valid;
                  }
                  *(undefined4 *)(local_328 + lVar40 * 4) = 0;
                  fVar85 = (ray->super_RayK<1>).tfar;
                  auVar80._0_4_ = -(uint)(auVar207._0_4_ <= fVar85) & local_328._0_4_;
                  auVar80._4_4_ = -(uint)(auVar207._4_4_ <= fVar85) & local_328._4_4_;
                  auVar80._8_4_ = -(uint)(auVar207._8_4_ <= fVar85) & local_328._8_4_;
                  auVar80._12_4_ = -(uint)(auVar207._12_4_ <= fVar85) & local_328._12_4_;
                  local_328 = auVar80;
                  uVar45 = movmskps((int)pRVar35,auVar80);
                  if (uVar45 != 0) {
                    auVar107._0_4_ = auVar80._0_4_ & (uint)auVar207._0_4_;
                    auVar107._4_4_ = auVar80._4_4_ & (uint)auVar207._4_4_;
                    auVar107._8_4_ = auVar80._8_4_ & (uint)auVar207._8_4_;
                    auVar107._12_4_ = auVar80._12_4_ & (uint)auVar207._12_4_;
                    auVar123._0_8_ = CONCAT44(~auVar80._4_4_,~auVar80._0_4_) & 0x7f8000007f800000;
                    auVar123._8_4_ = ~auVar80._8_4_ & 0x7f800000;
                    auVar123._12_4_ = ~auVar80._12_4_ & 0x7f800000;
                    auVar123 = auVar123 | auVar107;
                    auVar139._4_4_ = auVar123._0_4_;
                    auVar139._0_4_ = auVar123._4_4_;
                    auVar139._8_4_ = auVar123._12_4_;
                    auVar139._12_4_ = auVar123._8_4_;
                    auVar62 = minps(auVar139,auVar123);
                    auVar108._0_8_ = auVar62._8_8_;
                    auVar108._8_4_ = auVar62._0_4_;
                    auVar108._12_4_ = auVar62._4_4_;
                    auVar62 = minps(auVar108,auVar62);
                    auVar109._0_8_ =
                         CONCAT44(-(uint)(auVar62._4_4_ == auVar123._4_4_) & auVar80._4_4_,
                                  -(uint)(auVar62._0_4_ == auVar123._0_4_) & auVar80._0_4_);
                    auVar109._8_4_ = -(uint)(auVar62._8_4_ == auVar123._8_4_) & auVar80._8_4_;
                    auVar109._12_4_ = -(uint)(auVar62._12_4_ == auVar123._12_4_) & auVar80._12_4_;
                    iVar32 = movmskps((int)pRVar38,auVar109);
                    if (iVar32 != 0) {
                      auVar80._8_4_ = auVar109._8_4_;
                      auVar80._0_8_ = auVar109._0_8_;
                      auVar80._12_4_ = auVar109._12_4_;
                    }
                    uVar36 = movmskps(iVar32,auVar80);
                    uVar41 = CONCAT44((int)((ulong)pRVar38 >> 0x20),uVar36);
                    lVar40 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                      }
                    }
                  }
                } while ((char)uVar45 != '\0');
              }
            }
          }
        }
      }
      if (4 < iVar8) {
        local_58 = iVar8;
        iStack_54 = iVar8;
        iStack_50 = iVar8;
        iStack_4c = iVar8;
        fStack_284 = local_288;
        fStack_280 = local_288;
        fStack_27c = local_288;
        local_2a8._4_4_ = local_2a8._0_4_;
        fStack_2a0 = (float)local_2a8._0_4_;
        fStack_29c = (float)local_2a8._0_4_;
        local_208._4_4_ = 1.0 / (float)local_208._0_4_;
        local_208._0_4_ = local_208._4_4_;
        fStack_200 = (float)local_208._4_4_;
        fStack_1fc = (float)local_208._4_4_;
        lVar40 = 4;
        local_43c._20_4_ = fVar218;
        local_43c._24_4_ = fVar219;
        local_43c._28_4_ = fVar220;
        fStack_41c = fVar221;
        local_43c._4_16_ = auVar207;
        do {
          local_418 = auVar238;
          local_128 = (uint)lVar40;
          pauVar5 = (undefined1 (*) [12])(catmullrom_basis0 + lVar40 * 4 + lVar33);
          fVar112 = *(float *)*pauVar5;
          fVar218 = *(float *)(*pauVar5 + 4);
          fVar219 = *(float *)(*pauVar5 + 8);
          auVar14 = *pauVar5;
          fVar50 = *(float *)pauVar5[1];
          pfVar1 = (float *)(lVar33 + 0x22307f0 + lVar40 * 4);
          fVar83 = *pfVar1;
          fVar85 = pfVar1[1];
          fVar88 = pfVar1[2];
          fVar110 = pfVar1[3];
          pfVar1 = (float *)(lVar33 + 0x2230c74 + lVar40 * 4);
          local_1a8 = *pfVar1;
          fStack_1a4 = pfVar1[1];
          fStack_1a0 = pfVar1[2];
          fStack_19c = pfVar1[3];
          pauVar5 = (undefined1 (*) [12])(lVar33 + 0x22310f8 + lVar40 * 4);
          fVar220 = *(float *)*pauVar5;
          fVar221 = *(float *)(*pauVar5 + 4);
          fVar115 = *(float *)(*pauVar5 + 8);
          auVar13 = *pauVar5;
          fVar124 = *(float *)pauVar5[1];
          local_188 = local_1e8 * fVar112 +
                      local_268 * fVar83 + fVar154 * local_1a8 + local_348 * fVar220;
          fStack_184 = fStack_1e4 * fVar218 +
                       fStack_264 * fVar85 + fVar199 * fStack_1a4 + fStack_344 * fVar221;
          fStack_180 = fStack_1e0 * fVar219 +
                       fStack_260 * fVar88 + (float)auVar216[0] * fStack_1a0 + fStack_340 * fVar115;
          fStack_17c = fStack_1dc * fVar50 +
                       fStack_25c * fVar110 + (float)auVar217[0] * fStack_19c + fStack_33c * fVar124
          ;
          local_198 = local_178 * fVar112 +
                      local_3c8 * fVar83 + fVar116 * local_1a8 + local_248 * fVar220;
          fStack_194 = fStack_174 * fVar218 +
                       fStack_3c4 * fVar85 + fVar200 * fStack_1a4 + fStack_244 * fVar221;
          fStack_190 = fStack_170 * fVar219 +
                       fStack_3c0 * fVar88 + fVar208 * fStack_1a0 + fStack_240 * fVar115;
          fStack_18c = fStack_16c * fVar50 +
                       fStack_3bc * fVar110 + fVar209 * fStack_19c + fStack_23c * fVar124;
          fVar198 = local_98 * fVar112 +
                    local_88 * fVar83 + local_168 * local_1a8 + local_78 * fVar220;
          fVar210 = fStack_94 * fVar218 +
                    fStack_84 * fVar85 + fStack_164 * fStack_1a4 + fStack_74 * fVar221;
          local_2d8 = (undefined1  [8])CONCAT44(fVar210,fVar198);
          uStack_2d0._0_4_ =
               fStack_90 * fVar219 +
               fStack_80 * fVar88 + fStack_160 * fStack_1a0 + fStack_70 * fVar115;
          uStack_2d0._4_4_ =
               fStack_8c * fVar50 +
               fStack_7c * fVar110 + fStack_15c * fStack_19c + fStack_6c * fVar124;
          puVar34 = catmullrom_basis1 + lVar33;
          pfVar1 = (float *)(puVar34 + lVar40 * 4);
          fVar112 = *pfVar1;
          fVar115 = pfVar1[1];
          fVar125 = pfVar1[2];
          fVar127 = pfVar1[3];
          pfVar1 = (float *)(lVar33 + 0x2232c10 + lVar40 * 4);
          fVar140 = *pfVar1;
          fVar141 = pfVar1[1];
          fVar142 = pfVar1[2];
          fVar152 = pfVar1[3];
          pfVar1 = (float *)(lVar33 + 0x2233094 + lVar40 * 4);
          fVar153 = *pfVar1;
          fVar165 = pfVar1[1];
          fVar167 = pfVar1[2];
          fVar126 = pfVar1[3];
          pfVar1 = (float *)(lVar33 + 0x2233518 + lVar40 * 4);
          fVar170 = *pfVar1;
          fVar178 = pfVar1[1];
          fVar179 = pfVar1[2];
          fVar180 = pfVar1[3];
          fVar214 = local_1e8 * fVar112 +
                    local_268 * fVar140 + fVar154 * fVar153 + local_348 * fVar170;
          fVar215 = fStack_1e4 * fVar115 +
                    fStack_264 * fVar141 + fVar199 * fVar165 + fStack_344 * fVar178;
          fVar222 = fStack_1e0 * fVar125 +
                    fStack_260 * fVar142 + (float)auVar216[0] * fVar167 + fStack_340 * fVar179;
          fVar227 = fStack_1dc * fVar127 +
                    fStack_25c * fVar152 + (float)auVar217[0] * fVar126 + fStack_33c * fVar180;
          fVar247 = local_178 * fVar112 +
                    local_3c8 * fVar140 + fVar116 * fVar153 + local_248 * fVar170;
          fVar249 = fStack_174 * fVar115 +
                    fStack_3c4 * fVar141 + fVar200 * fVar165 + fStack_244 * fVar178;
          fVar251 = fStack_170 * fVar125 +
                    fStack_3c0 * fVar142 + fVar208 * fVar167 + fStack_240 * fVar179;
          fVar256 = fStack_16c * fVar127 +
                    fStack_3bc * fVar152 + fVar209 * fVar126 + fStack_23c * fVar180;
          local_368._0_4_ =
               local_98 * fVar112 + local_88 * fVar140 + local_168 * fVar153 + local_78 * fVar170;
          local_368._4_4_ =
               fStack_94 * fVar115 +
               fStack_84 * fVar141 + fStack_164 * fVar165 + fStack_74 * fVar178;
          uStack_360._0_4_ =
               fStack_90 * fVar125 +
               fStack_80 * fVar142 + fStack_160 * fVar167 + fStack_70 * fVar179;
          uStack_360._4_4_ =
               fStack_8c * fVar127 +
               fStack_7c * fVar152 + fStack_15c * fVar126 + fStack_6c * fVar180;
          fVar230 = fVar214 - local_188;
          fVar233 = fVar215 - fStack_184;
          fVar236 = fVar222 - fStack_180;
          fVar245 = fVar227 - fStack_17c;
          local_278 = fVar247 - local_198;
          fStack_274 = fVar249 - fStack_194;
          fStack_270 = fVar251 - fStack_190;
          fStack_26c = fVar256 - fStack_18c;
          fVar218 = local_198 * fVar230 - local_188 * local_278;
          fVar219 = fStack_194 * fVar233 - fStack_184 * fStack_274;
          fVar220 = fStack_190 * fVar236 - fStack_180 * fStack_270;
          fVar221 = fStack_18c * fVar245 - fStack_17c * fStack_26c;
          auVar206._8_4_ = (float)uStack_2d0;
          auVar206._0_8_ = local_2d8;
          auVar206._12_4_ = uStack_2d0._4_4_;
          auVar207 = maxps(auVar206,_local_368);
          bVar30 = fVar218 * fVar218 <=
                   auVar207._0_4_ * auVar207._0_4_ * (fVar230 * fVar230 + local_278 * local_278) &&
                   (int)local_128 < local_58;
          auVar242._0_4_ = -(uint)bVar30;
          bVar28 = (int)(local_128 | 1) < iStack_54 &&
                   fVar219 * fVar219 <=
                   auVar207._4_4_ * auVar207._4_4_ * (fVar233 * fVar233 + fStack_274 * fStack_274);
          auVar242._4_4_ = -(uint)bVar28;
          bVar31 = fVar220 * fVar220 <=
                   auVar207._8_4_ * auVar207._8_4_ * (fVar236 * fVar236 + fStack_270 * fStack_270)
                   && (int)(local_128 | 2) < iStack_50;
          auVar242._8_4_ = -(uint)bVar31;
          bVar29 = (int)(local_128 | 3) < iStack_4c &&
                   fVar221 * fVar221 <=
                   auVar207._12_4_ * auVar207._12_4_ * (fVar245 * fVar245 + fStack_26c * fStack_26c)
          ;
          auVar242._12_4_ = -(uint)bVar29;
          uVar43 = movmskps((int)p_Var39,auVar242);
          p_Var39 = (RTCFilterFunctionN)(ulong)uVar43;
          auVar207 = local_43c._4_16_;
          fVar218 = (float)local_43c._20_4_;
          fVar219 = (float)local_43c._24_4_;
          fVar220 = (float)local_43c._28_4_;
          fVar221 = fStack_41c;
          fVar154 = local_3f8;
          fVar199 = fStack_3f4;
          auVar216[0] = auStack_3f0[0];
          auVar217[0] = auStack_3ec[0];
          if (uVar43 != 0) {
            fVar252 = fVar170 * local_258 + fVar153 * local_1d8 + fVar140 * local_298 +
                      fVar112 * local_388;
            fVar257 = fVar178 * fStack_254 + fVar165 * fStack_1d4 + fVar141 * fStack_294 +
                      fVar115 * fStack_384;
            fVar259 = fVar179 * fStack_250 + fVar167 * fStack_1d0 + fVar142 * fStack_290 +
                      fVar125 * fStack_380;
            fVar260 = fVar180 * fStack_24c + fVar126 * fStack_1cc + fVar152 * fStack_28c +
                      fVar127 * fStack_37c;
            local_378._0_4_ = auVar14._0_4_;
            local_378._4_4_ = auVar14._4_4_;
            fStack_370 = auVar14._8_4_;
            fVar246 = (float)local_378._0_4_ * local_388;
            fVar248 = (float)local_378._4_4_ * fStack_384;
            fVar250 = fStack_370 * fStack_380;
            _local_378 = auVar242;
            local_3d8._0_4_ = auVar13._0_4_;
            local_3d8._4_4_ = auVar13._4_4_;
            fStack_3d0 = auVar13._8_4_;
            fVar246 = (float)local_3d8._0_4_ * local_258 + local_1a8 * local_1d8 +
                      fVar83 * local_298 + fVar246;
            fVar248 = (float)local_3d8._4_4_ * fStack_254 + fStack_1a4 * fStack_1d4 +
                      fVar85 * fStack_294 + fVar248;
            fVar250 = fStack_3d0 * fStack_250 + fStack_1a0 * fStack_1d0 + fVar88 * fStack_290 +
                      fVar250;
            fVar155 = fVar124 * fStack_24c + fStack_19c * fStack_1cc + fVar110 * fStack_28c +
                      fVar50 * fStack_37c;
            pfVar1 = (float *)(lVar33 + 0x223157c + lVar40 * 4);
            fVar112 = *pfVar1;
            fVar50 = pfVar1[1];
            fVar83 = pfVar1[2];
            fVar85 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x2231a00 + lVar40 * 4);
            fVar88 = *pfVar1;
            fVar110 = pfVar1[1];
            fVar115 = pfVar1[2];
            fVar124 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x2231e84 + lVar40 * 4);
            fVar125 = *pfVar1;
            fVar127 = pfVar1[1];
            fVar140 = pfVar1[2];
            fVar141 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x2232308 + lVar40 * 4);
            fVar142 = *pfVar1;
            fVar152 = pfVar1[1];
            fVar153 = pfVar1[2];
            fVar165 = pfVar1[3];
            fVar228 = local_1e8 * fVar112 +
                      local_268 * fVar88 + local_3f8 * fVar125 + local_348 * fVar142;
            fVar231 = fStack_1e4 * fVar50 +
                      fStack_264 * fVar110 + fStack_3f4 * fVar127 + fStack_344 * fVar152;
            fVar234 = fStack_1e0 * fVar83 +
                      fStack_260 * fVar115 + (float)auStack_3f0[0] * fVar140 + fStack_340 * fVar153;
            fVar261 = fStack_1dc * fVar85 +
                      fStack_25c * fVar124 + (float)auStack_3ec[0] * fVar141 + fStack_33c * fVar165;
            fVar89 = local_178 * fVar112 +
                     local_3c8 * fVar88 + fVar116 * fVar125 + local_248 * fVar142;
            fVar111 = fStack_174 * fVar50 +
                      fStack_3c4 * fVar110 + fVar200 * fVar127 + fStack_244 * fVar152;
            fVar113 = fStack_170 * fVar83 +
                      fStack_3c0 * fVar115 + fVar208 * fVar140 + fStack_240 * fVar153;
            fVar114 = fStack_16c * fVar85 +
                      fStack_3bc * fVar124 + fVar209 * fVar141 + fStack_23c * fVar165;
            pfVar1 = (float *)(lVar33 + 0x223399c + lVar40 * 4);
            fVar116 = *pfVar1;
            fVar167 = pfVar1[1];
            fVar126 = pfVar1[2];
            fVar170 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x22342a4 + lVar40 * 4);
            fVar178 = *pfVar1;
            fVar179 = pfVar1[1];
            fVar180 = pfVar1[2];
            fVar200 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x2234728 + lVar40 * 4);
            fVar208 = *pfVar1;
            fVar209 = pfVar1[1];
            fVar258 = pfVar1[2];
            fVar224 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x2233e20 + lVar40 * 4);
            fVar229 = *pfVar1;
            fVar232 = pfVar1[1];
            fVar235 = pfVar1[2];
            fVar237 = pfVar1[3];
            fVar264 = local_1e8 * fVar116 +
                      local_268 * fVar229 + local_3f8 * fVar178 + local_348 * fVar208;
            fVar265 = fStack_1e4 * fVar167 +
                      fStack_264 * fVar232 + fStack_3f4 * fVar179 + fStack_344 * fVar209;
            fVar266 = fStack_1e0 * fVar126 +
                      fStack_260 * fVar235 + (float)auStack_3f0[0] * fVar180 + fStack_340 * fVar258;
            fVar267 = fStack_1dc * fVar170 +
                      fStack_25c * fVar237 + (float)auStack_3ec[0] * fVar200 + fStack_33c * fVar224;
            fVar166 = local_178 * fVar116 +
                      local_3c8 * fVar229 + local_398 * fVar178 + local_248 * fVar208;
            fVar168 = fStack_174 * fVar167 +
                      fStack_3c4 * fVar232 + fStack_394 * fVar179 + fStack_244 * fVar209;
            fVar169 = fStack_170 * fVar126 +
                      fStack_3c0 * fVar235 + fStack_390 * fVar180 + fStack_240 * fVar258;
            fVar223 = fStack_16c * fVar170 +
                      fStack_3bc * fVar237 + fStack_38c * fVar200 + fStack_23c * fVar224;
            auVar243._0_8_ = CONCAT44(fVar231,fVar228) & 0x7fffffff7fffffff;
            auVar243._8_4_ = ABS(fVar234);
            auVar243._12_4_ = ABS(fVar261);
            auVar162._0_8_ = CONCAT44(fVar111,fVar89) & 0x7fffffff7fffffff;
            auVar162._8_4_ = ABS(fVar113);
            auVar162._12_4_ = ABS(fVar114);
            auVar62 = maxps(auVar243,auVar162);
            auVar100._0_8_ =
                 CONCAT44(fVar50 * fStack_384 +
                          fVar110 * fStack_294 + fVar127 * fStack_1d4 + fVar152 * fStack_254,
                          fVar112 * local_388 +
                          fVar88 * local_298 + fVar125 * local_1d8 + fVar142 * local_258) &
                 0x7fffffff7fffffff;
            auVar100._8_4_ =
                 ABS(fVar83 * fStack_380 +
                     fVar115 * fStack_290 + fVar140 * fStack_1d0 + fVar153 * fStack_250);
            auVar100._12_4_ =
                 ABS(fVar85 * fStack_37c +
                     fVar124 * fStack_28c + fVar141 * fStack_1cc + fVar165 * fStack_24c);
            auVar62 = maxps(auVar62,auVar100);
            uVar43 = -(uint)(local_288 <= auVar62._0_4_);
            uVar44 = -(uint)(fStack_284 <= auVar62._4_4_);
            uVar45 = -(uint)(fStack_280 <= auVar62._8_4_);
            uVar47 = -(uint)(fStack_27c <= auVar62._12_4_);
            auVar163._0_4_ = ~uVar43 & (uint)fVar230;
            auVar163._4_4_ = ~uVar44 & (uint)fVar233;
            auVar163._8_4_ = ~uVar45 & (uint)fVar236;
            auVar163._12_4_ = ~uVar47 & (uint)fVar245;
            auVar226._0_4_ = (uint)fVar228 & uVar43;
            auVar226._4_4_ = (uint)fVar231 & uVar44;
            auVar226._8_4_ = (uint)fVar234 & uVar45;
            auVar226._12_4_ = (uint)fVar261 & uVar47;
            auVar226 = auVar226 | auVar163;
            fVar127 = (float)(~uVar43 & (uint)local_278 | (uint)fVar89 & uVar43);
            fVar141 = (float)(~uVar44 & (uint)fStack_274 | (uint)fVar111 & uVar44);
            fVar165 = (float)(~uVar45 & (uint)fStack_270 | (uint)fVar113 & uVar45);
            fVar111 = (float)(~uVar47 & (uint)fStack_26c | (uint)fVar114 & uVar47);
            auVar255._0_8_ = CONCAT44(fVar265,fVar264) & 0x7fffffff7fffffff;
            auVar255._8_4_ = ABS(fVar266);
            auVar255._12_4_ = ABS(fVar267);
            auVar118._0_8_ = CONCAT44(fVar168,fVar166) & 0x7fffffff7fffffff;
            auVar118._8_4_ = ABS(fVar169);
            auVar118._12_4_ = ABS(fVar223);
            auVar62 = maxps(auVar255,auVar118);
            auVar77._0_8_ =
                 CONCAT44(fVar167 * fStack_384 +
                          fVar232 * fStack_294 + fVar179 * fStack_1d4 + fVar209 * fStack_254,
                          fVar116 * local_388 +
                          fVar229 * local_298 + fVar178 * local_1d8 + fVar208 * local_258) &
                 0x7fffffff7fffffff;
            auVar77._8_4_ =
                 ABS(fVar126 * fStack_380 +
                     fVar235 * fStack_290 + fVar180 * fStack_1d0 + fVar258 * fStack_250);
            auVar77._12_4_ =
                 ABS(fVar170 * fStack_37c +
                     fVar237 * fStack_28c + fVar200 * fStack_1cc + fVar224 * fStack_24c);
            auVar62 = maxps(auVar62,auVar77);
            uVar43 = -(uint)(local_288 <= auVar62._0_4_);
            uVar44 = -(uint)(fStack_284 <= auVar62._4_4_);
            uVar45 = -(uint)(fStack_280 <= auVar62._8_4_);
            uVar47 = -(uint)(fStack_27c <= auVar62._12_4_);
            fVar209 = (float)((uint)fVar264 & uVar43 | ~uVar43 & (uint)fVar230);
            fVar230 = (float)((uint)fVar265 & uVar44 | ~uVar44 & (uint)fVar233);
            fVar233 = (float)((uint)fVar266 & uVar45 | ~uVar45 & (uint)fVar236);
            fVar232 = (float)((uint)fVar267 & uVar47 | ~uVar47 & (uint)fVar245);
            fVar126 = (float)(~uVar43 & (uint)local_278 | (uint)fVar166 & uVar43);
            fVar178 = (float)(~uVar44 & (uint)fStack_274 | (uint)fVar168 & uVar44);
            fVar180 = (float)(~uVar45 & (uint)fStack_270 | (uint)fVar169 & uVar45);
            fVar208 = (float)(~uVar47 & (uint)fStack_26c | (uint)fVar223 & uVar47);
            fVar124 = auVar226._0_4_;
            fVar112 = auVar226._4_4_;
            fVar50 = auVar226._8_4_;
            fVar83 = auVar226._12_4_;
            auVar148._0_4_ = fVar127 * fVar127 + fVar124 * fVar124;
            auVar148._4_4_ = fVar141 * fVar141 + fVar112 * fVar112;
            auVar148._8_4_ = fVar165 * fVar165 + fVar50 * fVar50;
            auVar148._12_4_ = fVar111 * fVar111 + fVar83 * fVar83;
            auVar62 = rsqrtps(auVar163,auVar148);
            fVar85 = auVar62._0_4_;
            fVar88 = auVar62._4_4_;
            fVar110 = auVar62._8_4_;
            fVar115 = auVar62._12_4_;
            auVar164._0_4_ = fVar85 * fVar85 * auVar148._0_4_ * 0.5 * fVar85;
            auVar164._4_4_ = fVar88 * fVar88 * auVar148._4_4_ * 0.5 * fVar88;
            auVar164._8_4_ = fVar110 * fVar110 * auVar148._8_4_ * 0.5 * fVar110;
            auVar164._12_4_ = fVar115 * fVar115 * auVar148._12_4_ * 0.5 * fVar115;
            fVar142 = fVar85 * 1.5 - auVar164._0_4_;
            fVar152 = fVar88 * 1.5 - auVar164._4_4_;
            fVar153 = fVar110 * 1.5 - auVar164._8_4_;
            fVar116 = fVar115 * 1.5 - auVar164._12_4_;
            auVar149._0_4_ = fVar126 * fVar126 + fVar209 * fVar209;
            auVar149._4_4_ = fVar178 * fVar178 + fVar230 * fVar230;
            auVar149._8_4_ = fVar180 * fVar180 + fVar233 * fVar233;
            auVar149._12_4_ = fVar208 * fVar208 + fVar232 * fVar232;
            auVar62 = rsqrtps(auVar164,auVar149);
            fVar85 = auVar62._0_4_;
            fVar88 = auVar62._4_4_;
            fVar110 = auVar62._8_4_;
            fVar115 = auVar62._12_4_;
            fVar125 = fVar85 * 1.5 - fVar85 * fVar85 * auVar149._0_4_ * 0.5 * fVar85;
            fVar88 = fVar88 * 1.5 - fVar88 * fVar88 * auVar149._4_4_ * 0.5 * fVar88;
            fVar140 = fVar110 * 1.5 - fVar110 * fVar110 * auVar149._8_4_ * 0.5 * fVar110;
            fVar115 = fVar115 * 1.5 - fVar115 * fVar115 * auVar149._12_4_ * 0.5 * fVar115;
            fVar229 = fVar127 * fVar142 * fVar198;
            fVar235 = fVar141 * fVar152 * fVar210;
            fVar89 = fVar165 * fVar153 * (float)uStack_2d0;
            fVar113 = fVar111 * fVar116 * uStack_2d0._4_4_;
            fVar110 = -fVar124 * fVar142 * fVar198;
            fVar124 = -fVar112 * fVar152 * fVar210;
            fVar127 = -fVar50 * fVar153 * (float)uStack_2d0;
            fVar141 = -fVar83 * fVar116 * uStack_2d0._4_4_;
            fVar167 = fVar142 * 0.0 * fVar198;
            fVar170 = fVar152 * 0.0 * fVar210;
            fVar179 = fVar153 * 0.0 * (float)uStack_2d0;
            fVar200 = fVar116 * 0.0 * uStack_2d0._4_4_;
            local_3d8._0_4_ = fVar246 + fVar167;
            local_3d8._4_4_ = fVar248 + fVar170;
            fStack_3d0 = fVar250 + fVar179;
            fStack_3cc = fVar155 + fVar200;
            fVar166 = fVar126 * fVar125 * (float)local_368._0_4_;
            fVar168 = fVar178 * fVar88 * (float)local_368._4_4_;
            fVar169 = fVar180 * fVar140 * (float)uStack_360;
            fVar223 = fVar208 * fVar115 * uStack_360._4_4_;
            fVar236 = fVar214 + fVar166;
            fVar245 = fVar215 + fVar168;
            fVar258 = fVar222 + fVar169;
            fVar224 = fVar227 + fVar223;
            fVar112 = -fVar209 * fVar125 * (float)local_368._0_4_;
            fVar50 = -fVar230 * fVar88 * (float)local_368._4_4_;
            fVar83 = -fVar233 * fVar140 * (float)uStack_360;
            fVar85 = -fVar232 * fVar115 * uStack_360._4_4_;
            fVar208 = fVar247 + fVar112;
            fVar209 = fVar249 + fVar50;
            fVar230 = fVar251 + fVar83;
            fVar233 = fVar256 + fVar85;
            fVar142 = fVar125 * 0.0 * (float)local_368._0_4_;
            fVar152 = fVar88 * 0.0 * (float)local_368._4_4_;
            fVar153 = fVar140 * 0.0 * (float)uStack_360;
            fVar116 = fVar115 * 0.0 * uStack_360._4_4_;
            fVar165 = local_188 - fVar229;
            fVar126 = fStack_184 - fVar235;
            fVar178 = fStack_180 - fVar89;
            fVar180 = fStack_17c - fVar113;
            fVar232 = fVar252 + fVar142;
            fVar237 = fVar257 + fVar152;
            fVar111 = fVar259 + fVar153;
            fVar114 = fVar260 + fVar116;
            fVar88 = local_198 - fVar110;
            fVar115 = fStack_194 - fVar124;
            fVar125 = fStack_190 - fVar127;
            fVar140 = fStack_18c - fVar141;
            fVar246 = fVar246 - fVar167;
            fVar248 = fVar248 - fVar170;
            fVar250 = fVar250 - fVar179;
            fVar155 = fVar155 - fVar200;
            uVar43 = -(uint)(0.0 < (fVar88 * (fVar232 - fVar246) - fVar246 * (fVar208 - fVar88)) *
                                   0.0 + (fVar246 * (fVar236 - fVar165) -
                                         (fVar232 - fVar246) * fVar165) * 0.0 +
                                         ((fVar208 - fVar88) * fVar165 -
                                         (fVar236 - fVar165) * fVar88));
            uVar44 = -(uint)(0.0 < (fVar115 * (fVar237 - fVar248) - fVar248 * (fVar209 - fVar115)) *
                                   0.0 + (fVar248 * (fVar245 - fVar126) -
                                         (fVar237 - fVar248) * fVar126) * 0.0 +
                                         ((fVar209 - fVar115) * fVar126 -
                                         (fVar245 - fVar126) * fVar115));
            uVar45 = -(uint)(0.0 < (fVar125 * (fVar111 - fVar250) - fVar250 * (fVar230 - fVar125)) *
                                   0.0 + (fVar250 * (fVar258 - fVar178) -
                                         (fVar111 - fVar250) * fVar178) * 0.0 +
                                         ((fVar230 - fVar125) * fVar178 -
                                         (fVar258 - fVar178) * fVar125));
            uVar47 = -(uint)(0.0 < (fVar140 * (fVar114 - fVar155) - fVar155 * (fVar233 - fVar140)) *
                                   0.0 + (fVar155 * (fVar224 - fVar180) -
                                         (fVar114 - fVar155) * fVar180) * 0.0 +
                                         ((fVar233 - fVar140) * fVar180 -
                                         (fVar224 - fVar180) * fVar140));
            local_3e8._0_4_ =
                 (uint)(fVar214 - fVar166) & uVar43 | ~uVar43 & (uint)(local_188 + fVar229);
            local_3e8._4_4_ =
                 (uint)(fVar215 - fVar168) & uVar44 | ~uVar44 & (uint)(fStack_184 + fVar235);
            uStack_3e0._0_4_ =
                 (float)((uint)(fVar222 - fVar169) & uVar45 | ~uVar45 & (uint)(fStack_180 + fVar89))
            ;
            uStack_3e0._4_4_ =
                 (float)((uint)(fVar227 - fVar223) & uVar47 | ~uVar47 & (uint)(fStack_17c + fVar113)
                        );
            fVar214 = (float)((uint)(fVar247 - fVar112) & uVar43 |
                             ~uVar43 & (uint)(local_198 + fVar110));
            fVar215 = (float)((uint)(fVar249 - fVar50) & uVar44 |
                             ~uVar44 & (uint)(fStack_194 + fVar124));
            fVar222 = (float)((uint)(fVar251 - fVar83) & uVar45 |
                             ~uVar45 & (uint)(fStack_190 + fVar127));
            fVar227 = (float)((uint)(fVar256 - fVar85) & uVar47 |
                             ~uVar47 & (uint)(fStack_18c + fVar141));
            local_408 = (float)((uint)(fVar252 - fVar142) & uVar43 | ~uVar43 & local_3d8._0_4_);
            fStack_404 = (float)((uint)(fVar257 - fVar152) & uVar44 | ~uVar44 & local_3d8._4_4_);
            fStack_400 = (float)((uint)(fVar259 - fVar153) & uVar45 | ~uVar45 & (uint)fStack_3d0);
            fStack_3fc = (float)((uint)(fVar260 - fVar116) & uVar47 | ~uVar47 & (uint)fStack_3cc);
            fVar167 = (float)((uint)fVar165 & uVar43 | ~uVar43 & (uint)fVar236);
            fVar170 = (float)((uint)fVar126 & uVar44 | ~uVar44 & (uint)fVar245);
            fVar179 = (float)((uint)fVar178 & uVar45 | ~uVar45 & (uint)fVar258);
            fVar200 = (float)((uint)fVar180 & uVar47 | ~uVar47 & (uint)fVar224);
            fVar110 = (float)((uint)fVar88 & uVar43 | ~uVar43 & (uint)fVar208);
            fVar124 = (float)((uint)fVar115 & uVar44 | ~uVar44 & (uint)fVar209);
            fVar127 = (float)((uint)fVar125 & uVar45 | ~uVar45 & (uint)fVar230);
            fVar141 = (float)((uint)fVar140 & uVar47 | ~uVar47 & (uint)fVar233);
            fVar142 = (float)((uint)fVar246 & uVar43 | ~uVar43 & (uint)fVar232);
            fVar152 = (float)((uint)fVar248 & uVar44 | ~uVar44 & (uint)fVar237);
            fVar153 = (float)((uint)fVar250 & uVar45 | ~uVar45 & (uint)fVar111);
            fVar116 = (float)((uint)fVar155 & uVar47 | ~uVar47 & (uint)fVar114);
            fVar236 = (float)((uint)fVar236 & uVar43 | ~uVar43 & (uint)fVar165) -
                      (float)local_3e8._0_4_;
            fVar245 = (float)((uint)fVar245 & uVar44 | ~uVar44 & (uint)fVar126) -
                      (float)local_3e8._4_4_;
            fVar247 = (float)((uint)fVar258 & uVar45 | ~uVar45 & (uint)fVar178) - (float)uStack_3e0;
            fVar249 = (float)((uint)fVar224 & uVar47 | ~uVar47 & (uint)fVar180) - uStack_3e0._4_4_;
            fVar165 = (float)((uint)fVar208 & uVar43 | ~uVar43 & (uint)fVar88) - fVar214;
            fVar126 = (float)((uint)fVar209 & uVar44 | ~uVar44 & (uint)fVar115) - fVar215;
            fVar178 = (float)((uint)fVar230 & uVar45 | ~uVar45 & (uint)fVar125) - fVar222;
            fVar180 = (float)((uint)fVar233 & uVar47 | ~uVar47 & (uint)fVar140) - fVar227;
            fVar208 = (float)((uint)fVar232 & uVar43 | ~uVar43 & (uint)fVar246) - local_408;
            fVar209 = (float)((uint)fVar237 & uVar44 | ~uVar44 & (uint)fVar248) - fStack_404;
            fVar230 = (float)((uint)fVar111 & uVar45 | ~uVar45 & (uint)fVar250) - fStack_400;
            fVar233 = (float)((uint)fVar114 & uVar47 | ~uVar47 & (uint)fVar155) - fStack_3fc;
            fVar229 = (float)local_3e8._0_4_ - fVar167;
            fVar232 = (float)local_3e8._4_4_ - fVar170;
            fVar235 = (float)uStack_3e0 - fVar179;
            fVar237 = uStack_3e0._4_4_ - fVar200;
            fVar112 = fVar214 - fVar110;
            fVar50 = fVar215 - fVar124;
            fVar83 = fVar222 - fVar127;
            fVar85 = fVar227 - fVar141;
            fVar88 = local_408 - fVar142;
            fVar115 = fStack_404 - fVar152;
            fVar125 = fStack_400 - fVar153;
            fVar140 = fStack_3fc - fVar116;
            fVar251 = (fVar214 * fVar208 - local_408 * fVar165) * 0.0 +
                      (local_408 * fVar236 - (float)local_3e8._0_4_ * fVar208) * 0.0 +
                      ((float)local_3e8._0_4_ * fVar165 - fVar214 * fVar236);
            fVar256 = (fVar215 * fVar209 - fStack_404 * fVar126) * 0.0 +
                      (fStack_404 * fVar245 - (float)local_3e8._4_4_ * fVar209) * 0.0 +
                      ((float)local_3e8._4_4_ * fVar126 - fVar215 * fVar245);
            auVar135._4_4_ = fVar256;
            auVar135._0_4_ = fVar251;
            fVar258 = (fVar222 * fVar230 - fStack_400 * fVar178) * 0.0 +
                      (fStack_400 * fVar247 - (float)uStack_3e0 * fVar230) * 0.0 +
                      ((float)uStack_3e0 * fVar178 - fVar222 * fVar247);
            fVar224 = (fVar227 * fVar233 - fStack_3fc * fVar180) * 0.0 +
                      (fStack_3fc * fVar249 - uStack_3e0._4_4_ * fVar233) * 0.0 +
                      (uStack_3e0._4_4_ * fVar180 - fVar227 * fVar249);
            auVar263._0_4_ =
                 (fVar110 * fVar88 - fVar142 * fVar112) * 0.0 +
                 (fVar142 * fVar229 - fVar167 * fVar88) * 0.0 +
                 (fVar167 * fVar112 - fVar110 * fVar229);
            auVar263._4_4_ =
                 (fVar124 * fVar115 - fVar152 * fVar50) * 0.0 +
                 (fVar152 * fVar232 - fVar170 * fVar115) * 0.0 +
                 (fVar170 * fVar50 - fVar124 * fVar232);
            auVar263._8_4_ =
                 (fVar127 * fVar125 - fVar153 * fVar83) * 0.0 +
                 (fVar153 * fVar235 - fVar179 * fVar125) * 0.0 +
                 (fVar179 * fVar83 - fVar127 * fVar235);
            auVar263._12_4_ =
                 (fVar141 * fVar140 - fVar116 * fVar85) * 0.0 +
                 (fVar116 * fVar237 - fVar200 * fVar140) * 0.0 +
                 (fVar200 * fVar85 - fVar141 * fVar237);
            auVar135._8_4_ = fVar258;
            auVar135._12_4_ = fVar224;
            auVar62 = maxps(auVar135,auVar263);
            bVar30 = auVar62._0_4_ <= 0.0 && bVar30;
            auVar136._0_4_ = -(uint)bVar30;
            bVar28 = auVar62._4_4_ <= 0.0 && bVar28;
            auVar136._4_4_ = -(uint)bVar28;
            bVar31 = auVar62._8_4_ <= 0.0 && bVar31;
            auVar136._8_4_ = -(uint)bVar31;
            bVar29 = auVar62._12_4_ <= 0.0 && bVar29;
            auVar136._12_4_ = -(uint)bVar29;
            iVar32 = movmskps((int)puVar34,auVar136);
            if (iVar32 == 0) {
LAB_00b633c2:
              auVar120._8_8_ = uStack_2e0;
              auVar120._0_8_ = local_2e8;
            }
            else {
              fVar110 = (ray->super_RayK<1>).tfar;
              fVar127 = fVar112 * fVar208 - fVar88 * fVar165;
              fVar141 = fVar50 * fVar209 - fVar115 * fVar126;
              fVar142 = fVar83 * fVar230 - fVar125 * fVar178;
              fVar152 = fVar85 * fVar233 - fVar140 * fVar180;
              fVar88 = fVar88 * fVar236 - fVar208 * fVar229;
              fVar115 = fVar115 * fVar245 - fVar209 * fVar232;
              fVar124 = fVar125 * fVar247 - fVar230 * fVar235;
              fVar125 = fVar140 * fVar249 - fVar233 * fVar237;
              fVar140 = fVar229 * fVar165 - fVar112 * fVar236;
              fVar153 = fVar232 * fVar126 - fVar50 * fVar245;
              fVar116 = fVar235 * fVar178 - fVar83 * fVar247;
              fVar165 = fVar237 * fVar180 - fVar85 * fVar249;
              auVar119._0_4_ = fVar88 * 0.0 + fVar140;
              auVar119._4_4_ = fVar115 * 0.0 + fVar153;
              auVar119._8_4_ = fVar124 * 0.0 + fVar116;
              auVar119._12_4_ = fVar125 * 0.0 + fVar165;
              auVar177._0_4_ = fVar127 * 0.0 + auVar119._0_4_;
              auVar177._4_4_ = fVar141 * 0.0 + auVar119._4_4_;
              auVar177._8_4_ = fVar142 * 0.0 + auVar119._8_4_;
              auVar177._12_4_ = fVar152 * 0.0 + auVar119._12_4_;
              auVar62 = rcpps(auVar119,auVar177);
              fVar112 = auVar62._0_4_;
              fVar50 = auVar62._4_4_;
              fVar83 = auVar62._8_4_;
              fVar85 = auVar62._12_4_;
              fVar112 = (1.0 - auVar177._0_4_ * fVar112) * fVar112 + fVar112;
              fVar50 = (1.0 - auVar177._4_4_ * fVar50) * fVar50 + fVar50;
              fVar83 = (1.0 - auVar177._8_4_ * fVar83) * fVar83 + fVar83;
              fVar85 = (1.0 - auVar177._12_4_ * fVar85) * fVar85 + fVar85;
              fVar88 = (local_408 * fVar140 + fVar214 * fVar88 + (float)local_3e8._0_4_ * fVar127) *
                       fVar112;
              fVar115 = (fStack_404 * fVar153 + fVar215 * fVar115 + (float)local_3e8._4_4_ * fVar141
                        ) * fVar50;
              auVar244._4_4_ = fVar115;
              auVar244._0_4_ = fVar88;
              fVar124 = (fStack_400 * fVar116 + fVar222 * fVar124 + (float)uStack_3e0 * fVar142) *
                        fVar83;
              fVar125 = (fStack_3fc * fVar165 + fVar227 * fVar125 + uStack_3e0._4_4_ * fVar152) *
                        fVar85;
              bVar30 = ((float)local_2a8._0_4_ <= fVar88 && fVar88 <= fVar110) && bVar30;
              auVar150._0_4_ = -(uint)bVar30;
              bVar28 = ((float)local_2a8._4_4_ <= fVar115 && fVar115 <= fVar110) && bVar28;
              auVar150._4_4_ = -(uint)bVar28;
              bVar31 = (fStack_2a0 <= fVar124 && fVar124 <= fVar110) && bVar31;
              auVar150._8_4_ = -(uint)bVar31;
              bVar29 = (fStack_29c <= fVar125 && fVar125 <= fVar110) && bVar29;
              auVar150._12_4_ = -(uint)bVar29;
              iVar32 = movmskps(iVar32,auVar150);
              if (iVar32 == 0) goto LAB_00b633c2;
              auVar151._0_8_ =
                   CONCAT44(-(uint)(auVar177._4_4_ != 0.0 && bVar28),
                            -(uint)(auVar177._0_4_ != 0.0 && bVar30));
              auVar151._8_4_ = -(uint)(auVar177._8_4_ != 0.0 && bVar31);
              auVar151._12_4_ = -(uint)(auVar177._12_4_ != 0.0 && bVar29);
              iVar32 = movmskps(iVar32,auVar151);
              auVar120._8_8_ = uStack_2e0;
              auVar120._0_8_ = local_2e8;
              if (iVar32 != 0) {
                fVar251 = fVar251 * fVar112;
                fVar256 = fVar256 * fVar50;
                fVar258 = fVar258 * fVar83;
                fVar224 = fVar224 * fVar85;
                local_68 = (float)((uint)(1.0 - fVar251) & uVar43 | ~uVar43 & (uint)fVar251);
                fStack_64 = (float)((uint)(1.0 - fVar256) & uVar44 | ~uVar44 & (uint)fVar256);
                fStack_60 = (float)((uint)(1.0 - fVar258) & uVar45 | ~uVar45 & (uint)fVar258);
                fStack_5c = (float)((uint)(1.0 - fVar224) & uVar47 | ~uVar47 & (uint)fVar224);
                auVar120._8_4_ = auVar151._8_4_;
                auVar120._0_8_ = auVar151._0_8_;
                auVar120._12_4_ = auVar151._12_4_;
                auVar244._8_4_ = fVar124;
                auVar244._12_4_ = fVar125;
                local_1c8 = (float)(~uVar43 & (uint)(auVar263._0_4_ * fVar112) |
                                   (uint)(1.0 - auVar263._0_4_ * fVar112) & uVar43);
                fStack_1c4 = (float)(~uVar44 & (uint)(auVar263._4_4_ * fVar50) |
                                    (uint)(1.0 - auVar263._4_4_ * fVar50) & uVar44);
                fStack_1c0 = (float)(~uVar45 & (uint)(auVar263._8_4_ * fVar83) |
                                    (uint)(1.0 - auVar263._8_4_ * fVar83) & uVar45);
                fStack_1bc = (float)(~uVar47 & (uint)(auVar263._12_4_ * fVar85) |
                                    (uint)(1.0 - auVar263._12_4_ * fVar85) & uVar47);
                auVar238 = auVar244;
              }
            }
            uVar43 = movmskps(iVar32,auVar120);
            puVar34 = (undefined1 *)(ulong)uVar43;
            fVar116 = local_398;
            fVar200 = fStack_394;
            fVar208 = fStack_390;
            fVar209 = fStack_38c;
            if (uVar43 != 0) {
              fVar198 = ((float)local_368._0_4_ - fVar198) * local_68 + fVar198;
              fVar210 = ((float)local_368._4_4_ - fVar210) * fStack_64 + fVar210;
              fVar50 = ((float)uStack_360 - (float)uStack_2d0) * fStack_60 + (float)uStack_2d0;
              fVar83 = (uStack_360._4_4_ - uStack_2d0._4_4_) * fStack_5c + uStack_2d0._4_4_;
              fVar112 = pre->depth_scale;
              auVar78._0_4_ =
                   -(uint)(fVar112 * (fVar198 + fVar198) < auVar238._0_4_) & auVar120._0_4_;
              auVar78._4_4_ =
                   -(uint)(fVar112 * (fVar210 + fVar210) < auVar238._4_4_) & auVar120._4_4_;
              auVar78._8_4_ = -(uint)(fVar112 * (fVar50 + fVar50) < auVar238._8_4_) & auVar120._8_4_
              ;
              auVar78._12_4_ =
                   -(uint)(fVar112 * (fVar83 + fVar83) < auVar238._12_4_) & auVar120._12_4_;
              uVar43 = movmskps(uVar43,auVar78);
              puVar34 = (undefined1 *)(ulong)uVar43;
              if (uVar43 != 0) {
                local_1c8 = local_1c8 + local_1c8 + -1.0;
                fStack_1c4 = fStack_1c4 + fStack_1c4 + -1.0;
                fStack_1c0 = fStack_1c0 + fStack_1c0 + -1.0;
                fStack_1bc = fStack_1bc + fStack_1bc + -1.0;
                local_158 = local_68;
                fStack_154 = fStack_64;
                fStack_150 = fStack_60;
                fStack_14c = fStack_5c;
                local_148 = local_1c8;
                fStack_144 = fStack_1c4;
                fStack_140 = fStack_1c0;
                fStack_13c = fStack_1bc;
                local_138 = auVar238;
                local_124 = iVar8;
                local_118 = CONCAT44(fStack_334,local_338);
                uStack_110 = CONCAT44(fStack_32c,fStack_330);
                local_108 = local_2b8;
                fStack_104 = fStack_2b4;
                fStack_100 = fStack_2b0;
                fStack_fc = fStack_2ac;
                local_f8 = local_2c8;
                fStack_f4 = fStack_2c4;
                fStack_f0 = fStack_2c0;
                fStack_ec = fStack_2bc;
                local_e8 = CONCAT44(fStack_1f4,local_1f8);
                uStack_e0 = CONCAT44(fStack_1ec,fStack_1f0);
                local_d8 = auVar78;
                pGVar9 = (context->scene->geometries).items[local_3a0].ptr;
                uVar43 = (ray->super_RayK<1>).mask;
                if ((pGVar9->mask & uVar43) != 0) {
                  local_328 = auVar78;
                  fVar112 = (float)(int)local_128;
                  local_c8[0] = (fVar112 + local_68 + 0.0) * (float)local_208._0_4_;
                  local_c8[1] = (fVar112 + fStack_64 + 1.0) * (float)local_208._4_4_;
                  local_c8[2] = (fVar112 + fStack_60 + 2.0) * fStack_200;
                  local_c8[3] = (fVar112 + fStack_5c + 3.0) * fStack_1fc;
                  local_b8 = CONCAT44(fStack_1c4,local_1c8);
                  uStack_b0 = CONCAT44(fStack_1bc,fStack_1c0);
                  local_a8 = auVar238;
                  auVar101._0_4_ = auVar78._0_4_ & (uint)auVar238._0_4_;
                  auVar101._4_4_ = auVar78._4_4_ & (uint)auVar238._4_4_;
                  auVar101._8_4_ = auVar78._8_4_ & (uint)auVar238._8_4_;
                  auVar101._12_4_ = auVar78._12_4_ & (uint)auVar238._12_4_;
                  auVar121._0_8_ = CONCAT44(~auVar78._4_4_,~auVar78._0_4_) & 0x7f8000007f800000;
                  auVar121._8_4_ = ~auVar78._8_4_ & 0x7f800000;
                  auVar121._12_4_ = ~auVar78._12_4_ & 0x7f800000;
                  auVar121 = auVar121 | auVar101;
                  auVar137._4_4_ = auVar121._0_4_;
                  auVar137._0_4_ = auVar121._4_4_;
                  auVar137._8_4_ = auVar121._12_4_;
                  auVar137._12_4_ = auVar121._8_4_;
                  auVar62 = minps(auVar137,auVar121);
                  auVar102._0_8_ = auVar62._8_8_;
                  auVar102._8_4_ = auVar62._0_4_;
                  auVar102._12_4_ = auVar62._4_4_;
                  auVar62 = minps(auVar102,auVar62);
                  auVar103._0_8_ =
                       CONCAT44(-(uint)(auVar62._4_4_ == auVar121._4_4_) & auVar78._4_4_,
                                -(uint)(auVar62._0_4_ == auVar121._0_4_) & auVar78._0_4_);
                  auVar103._8_4_ = -(uint)(auVar62._8_4_ == auVar121._8_4_) & auVar78._8_4_;
                  auVar103._12_4_ = -(uint)(auVar62._12_4_ == auVar121._12_4_) & auVar78._12_4_;
                  iVar32 = movmskps(uVar43,auVar103);
                  if (iVar32 != 0) {
                    auVar78._8_4_ = auVar103._8_4_;
                    auVar78._0_8_ = auVar103._0_8_;
                    auVar78._12_4_ = auVar103._12_4_;
                  }
                  uVar43 = movmskps(iVar32,auVar78);
                  _local_408 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> _local_408 & 1) == 0; _local_408 = _local_408 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar112 = local_c8[_local_408];
                    fVar83 = 1.0 - fVar112;
                    fVar50 = fVar112 * 3.0;
                    fVar110 = ((fVar50 + 2.0) * (fVar83 + fVar83) + fVar83 * -3.0 * fVar83) * 0.5;
                    fVar85 = (fVar83 * -2.0 * fVar112 + fVar112 * fVar112) * 0.5;
                    fVar88 = (fVar112 * fVar50 + (fVar50 + -5.0) * (fVar112 + fVar112)) * 0.5;
                    fVar50 = *(float *)((long)&local_b8 + _local_408 * 4);
                    fVar83 = (fVar112 * (fVar83 + fVar83) - fVar83 * fVar83) * 0.5;
                    (ray->super_RayK<1>).tfar = *(float *)(local_a8 + _local_408 * 4);
                    *(ulong *)&(ray->Ng).field_0 =
                         CONCAT44(fVar83 * fStack_334 +
                                  fVar88 * fStack_2b4 + fVar110 * fStack_2c4 + fVar85 * fStack_1f4,
                                  fVar83 * local_338 +
                                  fVar88 * local_2b8 + fVar110 * local_2c8 + fVar85 * local_1f8);
                    (ray->Ng).field_0.field_0.z =
                         fVar83 * fStack_330 +
                         fVar88 * fStack_2b0 + fVar110 * fStack_2c0 + fVar85 * fStack_1f0;
                    ray->u = fVar112;
                    ray->v = fVar50;
                    ray->primID = (uint)local_350;
                    ray->geomID = (uint)local_3a0;
                    ray->instID[0] = context->user->instID[0];
                    uVar43 = context->user->instPrimID[0];
                    ray->instPrimID[0] = uVar43;
                  }
                  else {
                    local_3e8._4_4_ = fStack_2b4;
                    local_3e8._0_4_ = local_2b8;
                    uStack_3e0._4_4_ = fStack_2ac;
                    uStack_3e0._0_4_ = fStack_2b0;
                    local_368._4_4_ = fStack_2c4;
                    local_368._0_4_ = local_2c8;
                    uStack_360._4_4_ = fStack_2bc;
                    uStack_360._0_4_ = fStack_2c0;
                    uStack_2d0 = CONCAT44(fStack_1ec,fStack_1f0);
                    local_2d8 = (undefined1  [8])CONCAT44(fStack_1f4,local_1f8);
                    local_418 = auVar238;
                    local_3a8 = prim;
                    local_3b0 = context;
                    local_3b8 = pre;
                    do {
                      local_22c = local_c8[_local_408];
                      local_228 = *(undefined4 *)((long)&local_b8 + _local_408 * 4);
                      fVar112 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_a8 + _local_408 * 4);
                      fVar50 = 1.0 - local_22c;
                      fVar85 = local_22c * 3.0;
                      fVar88 = ((fVar85 + 2.0) * (fVar50 + fVar50) + fVar50 * -3.0 * fVar50) * 0.5;
                      fVar83 = (fVar50 * -2.0 * local_22c + local_22c * local_22c) * 0.5;
                      fVar85 = (local_22c * fVar85 + (fVar85 + -5.0) * (local_22c + local_22c)) *
                               0.5;
                      fVar50 = (local_22c * (fVar50 + fVar50) - fVar50 * fVar50) * 0.5;
                      local_318.context = context->user;
                      local_238 = CONCAT44(fVar50 * fStack_334 +
                                           fVar85 * (float)local_3e8._4_4_ +
                                           fVar88 * (float)local_368._4_4_ +
                                           fVar83 * (float)local_2d8._4_4_,
                                           fVar50 * local_338 +
                                           fVar85 * (float)local_3e8._0_4_ +
                                           fVar88 * (float)local_368._0_4_ +
                                           fVar83 * (float)local_2d8._0_4_);
                      local_230 = fVar50 * fStack_330 +
                                  fVar85 * (float)uStack_3e0 +
                                  fVar88 * (float)uStack_360 + fVar83 * (float)uStack_2d0;
                      local_224 = (int)local_350;
                      local_220 = (int)local_3a0;
                      local_21c = (local_318.context)->instID[0];
                      local_218 = (local_318.context)->instPrimID[0];
                      local_43c._0_4_ = -NAN;
                      local_318.valid = (int *)local_43c;
                      pRVar38 = (RTCIntersectArguments *)pGVar9->userPtr;
                      local_318.geometryUserPtr = pRVar38;
                      local_318.ray = (RTCRayN *)ray;
                      local_318.hit = (RTCHitN *)&local_238;
                      local_318.N = 1;
                      if ((pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar9->intersectionFilterN)(&local_318), p_Var39 = extraout_RDX,
                         prim = local_3a8, context = local_3b0, pre = local_3b8,
                         auVar207 = local_43c._4_16_, auVar238 = local_418,
                         fVar218 = (float)local_43c._20_4_, fVar219 = (float)local_43c._24_4_,
                         fVar220 = (float)local_43c._28_4_, fVar221 = fStack_41c,
                         fVar154 = local_3f8, fVar199 = fStack_3f4, auVar216[0] = auStack_3f0[0],
                         auVar217[0] = auStack_3ec[0], fVar116 = local_398, fVar200 = fStack_394,
                         fVar208 = fStack_390, fVar209 = fStack_38c,
                         (((RayK<1> *)local_318.valid)->org).field_0.m128[0] != 0.0)) {
                        pRVar38 = context->args;
                        if (pRVar38->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar38->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar38->filter)(&local_318);
                            p_Var39 = extraout_RDX_00;
                            prim = local_3a8;
                            context = local_3b0;
                            pre = local_3b8;
                            auVar207 = local_43c._4_16_;
                            auVar238 = local_418;
                            fVar218 = (float)local_43c._20_4_;
                            fVar219 = (float)local_43c._24_4_;
                            fVar220 = (float)local_43c._28_4_;
                            fVar221 = fStack_41c;
                            fVar154 = local_3f8;
                            fVar199 = fStack_3f4;
                            auVar216[0] = auStack_3f0[0];
                            auVar217[0] = auStack_3ec[0];
                            fVar116 = local_398;
                            fVar200 = fStack_394;
                            fVar208 = fStack_390;
                            fVar209 = fStack_38c;
                          }
                          if ((((RayK<1> *)local_318.valid)->org).field_0.m128[0] == 0.0)
                          goto LAB_00b63723;
                        }
                        (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_318.hit;
                        (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_318.hit + 4);
                        (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_318.hit + 8);
                        *(float *)((long)local_318.ray + 0x3c) = *(float *)(local_318.hit + 0xc);
                        *(float *)((long)local_318.ray + 0x40) = *(float *)(local_318.hit + 0x10);
                        *(float *)((long)local_318.ray + 0x44) = *(float *)(local_318.hit + 0x14);
                        *(float *)((long)local_318.ray + 0x48) = *(float *)(local_318.hit + 0x18);
                        p_Var39 = (RTCFilterFunctionN)(ulong)(uint)*(float *)(local_318.hit + 0x1c);
                        *(float *)((long)local_318.ray + 0x4c) = *(float *)(local_318.hit + 0x1c);
                        pRVar38 = (RTCIntersectArguments *)
                                  (ulong)(uint)*(float *)(local_318.hit + 0x20);
                        *(float *)((long)local_318.ray + 0x50) = *(float *)(local_318.hit + 0x20);
                        pRVar35 = (RayHit *)local_318.ray;
                      }
                      else {
LAB_00b63723:
                        (ray->super_RayK<1>).tfar = fVar112;
                        pRVar35 = (RayHit *)local_318.valid;
                      }
                      *(undefined4 *)(local_328 + _local_408 * 4) = 0;
                      fVar112 = (ray->super_RayK<1>).tfar;
                      auVar79._0_4_ = -(uint)(auVar238._0_4_ <= fVar112) & local_328._0_4_;
                      auVar79._4_4_ = -(uint)(auVar238._4_4_ <= fVar112) & local_328._4_4_;
                      auVar79._8_4_ = -(uint)(auVar238._8_4_ <= fVar112) & local_328._8_4_;
                      auVar79._12_4_ = -(uint)(auVar238._12_4_ <= fVar112) & local_328._12_4_;
                      local_328 = auVar79;
                      uVar43 = movmskps((int)pRVar35,auVar79);
                      if (uVar43 != 0) {
                        auVar104._0_4_ = auVar79._0_4_ & (uint)auVar238._0_4_;
                        auVar104._4_4_ = auVar79._4_4_ & (uint)auVar238._4_4_;
                        auVar104._8_4_ = auVar79._8_4_ & (uint)auVar238._8_4_;
                        auVar104._12_4_ = auVar79._12_4_ & (uint)auVar238._12_4_;
                        auVar122._0_8_ =
                             CONCAT44(~auVar79._4_4_,~auVar79._0_4_) & 0x7f8000007f800000;
                        auVar122._8_4_ = ~auVar79._8_4_ & 0x7f800000;
                        auVar122._12_4_ = ~auVar79._12_4_ & 0x7f800000;
                        auVar122 = auVar122 | auVar104;
                        auVar138._4_4_ = auVar122._0_4_;
                        auVar138._0_4_ = auVar122._4_4_;
                        auVar138._8_4_ = auVar122._12_4_;
                        auVar138._12_4_ = auVar122._8_4_;
                        auVar62 = minps(auVar138,auVar122);
                        auVar105._0_8_ = auVar62._8_8_;
                        auVar105._8_4_ = auVar62._0_4_;
                        auVar105._12_4_ = auVar62._4_4_;
                        auVar62 = minps(auVar105,auVar62);
                        auVar106._0_8_ =
                             CONCAT44(-(uint)(auVar62._4_4_ == auVar122._4_4_) & auVar79._4_4_,
                                      -(uint)(auVar62._0_4_ == auVar122._0_4_) & auVar79._0_4_);
                        auVar106._8_4_ = -(uint)(auVar62._8_4_ == auVar122._8_4_) & auVar79._8_4_;
                        auVar106._12_4_ =
                             -(uint)(auVar62._12_4_ == auVar122._12_4_) & auVar79._12_4_;
                        iVar32 = movmskps((int)pRVar38,auVar106);
                        if (iVar32 != 0) {
                          auVar79._8_4_ = auVar106._8_4_;
                          auVar79._0_8_ = auVar106._0_8_;
                          auVar79._12_4_ = auVar106._12_4_;
                        }
                        uVar36 = movmskps(iVar32,auVar79);
                        uVar41 = CONCAT44((int)((ulong)pRVar38 >> 0x20),uVar36);
                        _local_408 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> _local_408 & 1) == 0; _local_408 = _local_408 + 1) {
                          }
                        }
                      }
                    } while ((char)uVar43 != '\0');
                  }
                }
                puVar34 = (undefined1 *)(ulong)uVar43;
              }
            }
          }
          uVar45 = (uint)puVar34;
          lVar40 = lVar40 + 4;
        } while ((int)lVar40 < iVar8);
      }
      fVar112 = (ray->super_RayK<1>).tfar;
      auVar99._4_4_ = -(uint)(fStack_44 <= fVar112);
      auVar99._0_4_ = -(uint)(local_48 <= fVar112);
      auVar99._8_4_ = -(uint)(fStack_40 <= fVar112);
      auVar99._12_4_ = -(uint)(fStack_3c <= fVar112);
      uVar43 = movmskps(uVar45,auVar99);
      uVar43 = (uint)uVar42 & uVar43;
    } while (uVar43 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }